

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  byte bVar58;
  byte bVar59;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar60;
  long lVar61;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  long lVar65;
  int iVar66;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong uVar67;
  byte bVar68;
  bool bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar144;
  uint uVar145;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  uint uVar146;
  uint uVar150;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar143 [64];
  float pp;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar180 [16];
  undefined1 auVar185 [32];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar223;
  float fVar224;
  undefined1 auVar207 [16];
  float fVar225;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar222 [32];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar242;
  undefined1 auVar240 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar241 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float fVar252;
  float fVar259;
  undefined1 auVar255 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar258;
  undefined1 auVar256 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  float s;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  float fVar269;
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  undefined1 local_940 [16];
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar139 [64];
  undefined1 auVar142 [64];
  undefined1 auVar160 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  lVar61 = uVar70 * 0x25;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar101 = vpmovsxbd_avx2(auVar73);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar72);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar3);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar70 * 0xf + 6);
  auVar104 = vpmovsxbd_avx2(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar102 = vpmovsxbd_avx2(auVar76);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar70 * 0x11 + 6);
  auVar99 = vpmovsxbd_avx2(auVar4);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar70 * 0x1a + 6);
  auVar100 = vpmovsxbd_avx2(auVar74);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 * 0x1b + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  fVar2 = *(float *)(prim + lVar61 + 0x12);
  auVar78._4_4_ = fVar2;
  auVar78._0_4_ = fVar2;
  auVar78._8_4_ = fVar2;
  auVar78._12_4_ = fVar2;
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar73 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + lVar61 + 6));
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar70 * 0x1c + 6);
  auVar94 = vpmovsxbd_avx2(auVar77);
  fVar229 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xb + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar84 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar70 * 0xd + 6));
  auVar86 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar70 * 0x12 + 6));
  auVar87 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar70 * 0x16 + 6));
  auVar72 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar72 = vinsertps_avx512f(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  fVar269 = fVar2 * auVar73._0_4_;
  auVar72 = vmulps_avx512vl(auVar78,auVar72);
  auVar88 = vcvtdq2ps_avx512vl(auVar101);
  auVar89 = vcvtdq2ps_avx512vl(auVar98);
  auVar90 = vcvtdq2ps_avx512vl(auVar103);
  auVar91 = vcvtdq2ps_avx512vl(auVar104);
  auVar92 = vcvtdq2ps_avx512vl(auVar102);
  auVar101 = vcvtdq2ps_avx(auVar99);
  auVar103 = vcvtdq2ps_avx(auVar100);
  auVar104 = vcvtdq2ps_avx(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar94);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar169 = auVar72._0_4_;
  auVar108._4_4_ = uVar169;
  auVar108._0_4_ = uVar169;
  auVar108._8_4_ = uVar169;
  auVar108._12_4_ = uVar169;
  auVar108._16_4_ = uVar169;
  auVar108._20_4_ = uVar169;
  auVar108._24_4_ = uVar169;
  auVar108._28_4_ = uVar169;
  auVar94 = vpermps_avx512vl(auVar93,ZEXT1632(auVar72));
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = vpermps_avx512vl(auVar95,ZEXT1632(auVar72));
  auVar97 = vmulps_avx512vl(auVar96,auVar90);
  auVar99._4_4_ = auVar96._4_4_ * auVar101._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar101._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar101._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar101._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * auVar101._16_4_;
  auVar99._20_4_ = auVar96._20_4_ * auVar101._20_4_;
  auVar99._24_4_ = auVar96._24_4_ * auVar101._24_4_;
  auVar99._28_4_ = auVar98._28_4_;
  auVar100._4_4_ = auVar102._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar102._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar102._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar102._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar102._16_4_ * auVar96._16_4_;
  auVar100._20_4_ = auVar102._20_4_ * auVar96._20_4_;
  auVar100._24_4_ = auVar102._24_4_ * auVar96._24_4_;
  auVar100._28_4_ = auVar96._28_4_;
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar89);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar92);
  auVar72 = vfmadd231ps_fma(auVar100,auVar104,auVar94);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar108,auVar88);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,auVar91);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar103,auVar108);
  auVar96._4_4_ = fVar269;
  auVar96._0_4_ = fVar269;
  auVar96._8_4_ = fVar269;
  auVar96._12_4_ = fVar269;
  auVar96._16_4_ = fVar269;
  auVar96._20_4_ = fVar269;
  auVar96._24_4_ = fVar269;
  auVar96._28_4_ = fVar269;
  auVar94 = ZEXT1632(CONCAT412(fVar2 * auVar73._12_4_,
                               CONCAT48(fVar2 * auVar73._8_4_,
                                        CONCAT44(fVar2 * auVar73._4_4_,fVar269))));
  auVar100 = vpermps_avx512vl(auVar93,auVar94);
  auVar95 = vpermps_avx512vl(auVar95,auVar94);
  auVar90 = vmulps_avx512vl(auVar95,auVar90);
  auVar93._4_4_ = auVar95._4_4_ * auVar101._4_4_;
  auVar93._0_4_ = auVar95._0_4_ * auVar101._0_4_;
  auVar93._8_4_ = auVar95._8_4_ * auVar101._8_4_;
  auVar93._12_4_ = auVar95._12_4_ * auVar101._12_4_;
  auVar93._16_4_ = auVar95._16_4_ * auVar101._16_4_;
  auVar93._20_4_ = auVar95._20_4_ * auVar101._20_4_;
  auVar93._24_4_ = auVar95._24_4_ * auVar101._24_4_;
  auVar93._28_4_ = uVar169;
  auVar94._4_4_ = auVar95._4_4_ * auVar102._4_4_;
  auVar94._0_4_ = auVar95._0_4_ * auVar102._0_4_;
  auVar94._8_4_ = auVar95._8_4_ * auVar102._8_4_;
  auVar94._12_4_ = auVar95._12_4_ * auVar102._12_4_;
  auVar94._16_4_ = auVar95._16_4_ * auVar102._16_4_;
  auVar94._20_4_ = auVar95._20_4_ * auVar102._20_4_;
  auVar94._24_4_ = auVar95._24_4_ * auVar102._24_4_;
  auVar94._28_4_ = auVar101._28_4_;
  auVar101 = vfmadd231ps_avx512vl(auVar90,auVar100,auVar89);
  auVar102 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar92);
  auVar73 = vfmadd231ps_fma(auVar94,auVar100,auVar104);
  auVar100 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar88);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,auVar91);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar96,auVar103);
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  auVar95._8_4_ = 0x219392ef;
  auVar95._0_8_ = 0x219392ef219392ef;
  auVar95._12_4_ = 0x219392ef;
  auVar95._16_4_ = 0x219392ef;
  auVar95._20_4_ = 0x219392ef;
  auVar95._24_4_ = 0x219392ef;
  auVar95._28_4_ = 0x219392ef;
  auVar101 = vandps_avx(auVar91,auVar98);
  uVar67 = vcmpps_avx512vl(auVar101,auVar95,1);
  bVar69 = (bool)((byte)uVar67 & 1);
  auVar88._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._0_4_;
  bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._4_4_;
  bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._8_4_;
  bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._12_4_;
  bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
  auVar88._16_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._16_4_;
  bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
  auVar88._20_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._20_4_;
  bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
  auVar88._24_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._24_4_;
  bVar69 = SUB81(uVar67 >> 7,0);
  auVar88._28_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar98._28_4_;
  auVar101 = vandps_avx(auVar91,auVar99);
  uVar67 = vcmpps_avx512vl(auVar101,auVar95,1);
  bVar69 = (bool)((byte)uVar67 & 1);
  auVar89._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._0_4_;
  bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._4_4_;
  bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._8_4_;
  bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._12_4_;
  bVar69 = (bool)((byte)(uVar67 >> 4) & 1);
  auVar89._16_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._16_4_;
  bVar69 = (bool)((byte)(uVar67 >> 5) & 1);
  auVar89._20_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._20_4_;
  bVar69 = (bool)((byte)(uVar67 >> 6) & 1);
  auVar89._24_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._24_4_;
  bVar69 = SUB81(uVar67 >> 7,0);
  auVar89._28_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar99._28_4_;
  auVar101 = vandps_avx(auVar91,ZEXT1632(auVar72));
  uVar67 = vcmpps_avx512vl(auVar101,auVar95,1);
  bVar69 = (bool)((byte)uVar67 & 1);
  auVar101._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._0_4_;
  bVar69 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._4_4_;
  bVar69 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._8_4_;
  bVar69 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar72._12_4_;
  auVar101._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar101._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar101._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar101._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar88);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  auVar92._16_4_ = 0x3f800000;
  auVar92._20_4_ = 0x3f800000;
  auVar92._24_4_ = 0x3f800000;
  auVar92._28_4_ = 0x3f800000;
  auVar73 = vfnmadd213ps_fma(auVar88,auVar103,auVar92);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar89);
  auVar72 = vfnmadd213ps_fma(auVar89,auVar103,auVar92);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar101);
  auVar3 = vfnmadd213ps_fma(auVar101,auVar103,auVar92);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar103,auVar103);
  auVar90._4_4_ = fVar229;
  auVar90._0_4_ = fVar229;
  auVar90._8_4_ = fVar229;
  auVar90._12_4_ = fVar229;
  auVar90._16_4_ = fVar229;
  auVar90._20_4_ = fVar229;
  auVar90._24_4_ = fVar229;
  auVar90._28_4_ = fVar229;
  auVar101 = vcvtdq2ps_avx(auVar105);
  auVar103 = vcvtdq2ps_avx(auVar106);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar75 = vfmadd213ps_fma(auVar103,auVar90,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar107);
  auVar103 = vcvtdq2ps_avx512vl(auVar85);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar76 = vfmadd213ps_fma(auVar103,auVar90,auVar101);
  auVar103 = vcvtdq2ps_avx512vl(auVar86);
  auVar101 = vcvtdq2ps_avx512vl(auVar87);
  auVar101 = vsubps_avx(auVar101,auVar103);
  auVar4 = vfmadd213ps_fma(auVar101,auVar90,auVar103);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x14 + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x18 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x1d + 6));
  auVar74 = vfmadd213ps_fma(auVar103,auVar90,auVar101);
  auVar101 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x21 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar83 = vfmadd213ps_fma(auVar103,auVar90,auVar101);
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x1f + 6));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x23 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,auVar101);
  auVar77 = vfmadd213ps_fma(auVar103,auVar90,auVar101);
  auVar101 = vsubps_avx512vl(ZEXT1632(auVar75),auVar100);
  auVar105._4_4_ = auVar73._4_4_ * auVar101._4_4_;
  auVar105._0_4_ = auVar73._0_4_ * auVar101._0_4_;
  auVar105._8_4_ = auVar73._8_4_ * auVar101._8_4_;
  auVar105._12_4_ = auVar73._12_4_ * auVar101._12_4_;
  auVar105._16_4_ = auVar101._16_4_ * 0.0;
  auVar105._20_4_ = auVar101._20_4_ * 0.0;
  auVar105._24_4_ = auVar101._24_4_ * 0.0;
  auVar105._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx512vl(ZEXT1632(auVar76),auVar100);
  auVar87._0_4_ = auVar73._0_4_ * auVar101._0_4_;
  auVar87._4_4_ = auVar73._4_4_ * auVar101._4_4_;
  auVar87._8_4_ = auVar73._8_4_ * auVar101._8_4_;
  auVar87._12_4_ = auVar73._12_4_ * auVar101._12_4_;
  auVar87._16_4_ = auVar101._16_4_ * 0.0;
  auVar87._20_4_ = auVar101._20_4_ * 0.0;
  auVar87._24_4_ = auVar101._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar4),auVar102);
  auVar106._4_4_ = auVar72._4_4_ * auVar101._4_4_;
  auVar106._0_4_ = auVar72._0_4_ * auVar101._0_4_;
  auVar106._8_4_ = auVar72._8_4_ * auVar101._8_4_;
  auVar106._12_4_ = auVar72._12_4_ * auVar101._12_4_;
  auVar106._16_4_ = auVar101._16_4_ * 0.0;
  auVar106._20_4_ = auVar101._20_4_ * 0.0;
  auVar106._24_4_ = auVar101._24_4_ * 0.0;
  auVar106._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar74),auVar102);
  auVar86._0_4_ = auVar72._0_4_ * auVar101._0_4_;
  auVar86._4_4_ = auVar72._4_4_ * auVar101._4_4_;
  auVar86._8_4_ = auVar72._8_4_ * auVar101._8_4_;
  auVar86._12_4_ = auVar72._12_4_ * auVar101._12_4_;
  auVar86._16_4_ = auVar101._16_4_ * 0.0;
  auVar86._20_4_ = auVar101._20_4_ * 0.0;
  auVar86._24_4_ = auVar101._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar101 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar78));
  auVar107._4_4_ = auVar3._4_4_ * auVar101._4_4_;
  auVar107._0_4_ = auVar3._0_4_ * auVar101._0_4_;
  auVar107._8_4_ = auVar3._8_4_ * auVar101._8_4_;
  auVar107._12_4_ = auVar3._12_4_ * auVar101._12_4_;
  auVar107._16_4_ = auVar101._16_4_ * 0.0;
  auVar107._20_4_ = auVar101._20_4_ * 0.0;
  auVar107._24_4_ = auVar101._24_4_ * 0.0;
  auVar107._28_4_ = auVar101._28_4_;
  auVar101 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar78));
  auVar85._0_4_ = auVar3._0_4_ * auVar101._0_4_;
  auVar85._4_4_ = auVar3._4_4_ * auVar101._4_4_;
  auVar85._8_4_ = auVar3._8_4_ * auVar101._8_4_;
  auVar85._12_4_ = auVar3._12_4_ * auVar101._12_4_;
  auVar85._16_4_ = auVar101._16_4_ * 0.0;
  auVar85._20_4_ = auVar101._20_4_ * 0.0;
  auVar85._24_4_ = auVar101._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar101 = vpminsd_avx2(auVar105,auVar87);
  auVar103 = vpminsd_avx2(auVar106,auVar86);
  auVar101 = vmaxps_avx(auVar101,auVar103);
  auVar103 = vpminsd_avx2(auVar107,auVar85);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar104._4_4_ = uVar169;
  auVar104._0_4_ = uVar169;
  auVar104._8_4_ = uVar169;
  auVar104._12_4_ = uVar169;
  auVar104._16_4_ = uVar169;
  auVar104._20_4_ = uVar169;
  auVar104._24_4_ = uVar169;
  auVar104._28_4_ = uVar169;
  auVar103 = vmaxps_avx512vl(auVar103,auVar104);
  auVar101 = vmaxps_avx(auVar101,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar101,auVar103);
  auVar101 = vpmaxsd_avx2(auVar105,auVar87);
  auVar103 = vpmaxsd_avx2(auVar106,auVar86);
  auVar101 = vminps_avx(auVar101,auVar103);
  auVar103 = vpmaxsd_avx2(auVar107,auVar85);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar102._4_4_ = uVar169;
  auVar102._0_4_ = uVar169;
  auVar102._8_4_ = uVar169;
  auVar102._12_4_ = uVar169;
  auVar102._16_4_ = uVar169;
  auVar102._20_4_ = uVar169;
  auVar102._24_4_ = uVar169;
  auVar102._28_4_ = uVar169;
  auVar103 = vminps_avx512vl(auVar103,auVar102);
  auVar101 = vminps_avx(auVar101,auVar103);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar101 = vmulps_avx512vl(auVar101,auVar98);
  uVar18 = vcmpps_avx512vl(local_680,auVar101,2);
  uVar20 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  local_908 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  auVar168 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar168);
  local_910 = prim;
LAB_01ba61b6:
  if (local_908 == 0) {
LAB_01ba8c01:
    return local_908 != 0;
  }
  lVar61 = 0;
  for (uVar67 = local_908; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar5 = *(uint *)(local_910 + 2);
  pGVar6 = (context->scene->geometries).items[uVar5].ptr;
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(local_910 + lVar61 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar2 = (pGVar6->time_range).lower;
  fVar2 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x1c0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
  auVar73 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  auVar73 = vminss_avx(auVar73,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar73);
  fVar2 = fVar2 - auVar73._0_4_;
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar65 = (long)(int)auVar73._0_4_ * 0x38;
  lVar61 = *(long *)(_Var7 + 0x10 + lVar65);
  lVar8 = *(long *)(_Var7 + 0x38 + lVar65);
  lVar9 = *(long *)(_Var7 + 0x48 + lVar65);
  pfVar1 = (float *)(lVar8 + uVar67 * lVar9);
  auVar81._0_4_ = fVar2 * *pfVar1;
  auVar81._4_4_ = fVar2 * pfVar1[1];
  auVar81._8_4_ = fVar2 * pfVar1[2];
  auVar81._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + (uVar67 + 1) * lVar9);
  auVar187._0_4_ = fVar2 * *pfVar1;
  auVar187._4_4_ = fVar2 * pfVar1[1];
  auVar187._8_4_ = fVar2 * pfVar1[2];
  auVar187._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + (uVar67 + 2) * lVar9);
  auVar207._0_4_ = fVar2 * *pfVar1;
  auVar207._4_4_ = fVar2 * pfVar1[1];
  auVar207._8_4_ = fVar2 * pfVar1[2];
  auVar207._12_4_ = fVar2 * pfVar1[3];
  pfVar1 = (float *)(lVar8 + lVar9 * (uVar67 + 3));
  auVar82._0_4_ = fVar2 * *pfVar1;
  auVar82._4_4_ = fVar2 * pfVar1[1];
  auVar82._8_4_ = fVar2 * pfVar1[2];
  auVar82._12_4_ = fVar2 * pfVar1[3];
  auVar168 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar168);
  lVar8 = *(long *)(_Var7 + lVar65);
  fVar2 = 1.0 - fVar2;
  auVar80._4_4_ = fVar2;
  auVar80._0_4_ = fVar2;
  auVar80._8_4_ = fVar2;
  auVar80._12_4_ = fVar2;
  auVar3 = vfmadd231ps_fma(auVar81,auVar80,*(undefined1 (*) [16])(lVar8 + lVar61 * uVar67));
  auVar75 = vfmadd231ps_fma(auVar187,auVar80,*(undefined1 (*) [16])(lVar8 + lVar61 * (uVar67 + 1)));
  auVar76 = vfmadd231ps_fma(auVar207,auVar80,*(undefined1 (*) [16])(lVar8 + lVar61 * (uVar67 + 2)));
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar72 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar266._4_4_ = uVar169;
  auVar266._0_4_ = uVar169;
  auVar266._8_4_ = uVar169;
  auVar266._12_4_ = uVar169;
  local_840._16_4_ = uVar169;
  local_840._0_16_ = auVar266;
  local_840._20_4_ = uVar169;
  local_840._24_4_ = uVar169;
  local_840._28_4_ = uVar169;
  uVar169 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar267._4_4_ = uVar169;
  auVar267._0_4_ = uVar169;
  auVar267._8_4_ = uVar169;
  auVar267._12_4_ = uVar169;
  local_860._16_4_ = uVar169;
  local_860._0_16_ = auVar267;
  local_860._20_4_ = uVar169;
  local_860._24_4_ = uVar169;
  local_860._28_4_ = uVar169;
  auVar73 = vunpcklps_avx(auVar266,auVar267);
  auVar168._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar83 = auVar168._0_16_;
  local_9d0 = vinsertps_avx512f(auVar73,auVar83,0x28);
  auVar260 = ZEXT1664(local_9d0);
  auVar240._0_4_ = auVar3._0_4_ + auVar75._0_4_;
  auVar240._4_4_ = auVar3._4_4_ + auVar75._4_4_;
  auVar240._8_4_ = auVar3._8_4_ + auVar75._8_4_;
  auVar240._12_4_ = auVar3._12_4_ + auVar75._12_4_;
  auVar79._8_4_ = 0x3f000000;
  auVar79._0_8_ = 0x3f0000003f000000;
  auVar79._12_4_ = 0x3f000000;
  auVar73 = vmulps_avx512vl(auVar240,auVar79);
  auVar73 = vsubps_avx(auVar73,auVar72);
  auVar73 = vdpps_avx(auVar73,local_9d0,0x7f);
  fVar2 = *(float *)(ray + k * 4 + 0xc0);
  auVar262 = ZEXT464((uint)fVar2);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar246._4_12_ = ZEXT812(0) << 0x20;
  auVar246._0_4_ = local_9e0._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar246);
  auVar4 = vfnmadd213ss_fma(auVar74,local_9e0,ZEXT416(0x40000000));
  local_660 = auVar73._0_4_ * auVar4._0_4_ * auVar74._0_4_;
  auVar247._4_4_ = local_660;
  auVar247._0_4_ = local_660;
  auVar247._8_4_ = local_660;
  auVar247._12_4_ = local_660;
  fStack_810 = local_660;
  _local_820 = auVar247;
  fStack_80c = local_660;
  fStack_808 = local_660;
  fStack_804 = local_660;
  auVar73 = vfmadd231ps_fma(auVar72,local_9d0,auVar247);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar3 = vsubps_avx(auVar3,auVar73);
  auVar251 = ZEXT1664(auVar3);
  auVar72 = vsubps_avx(auVar76,auVar73);
  auVar76 = vfmadd231ps_fma(auVar82,auVar80,*(undefined1 (*) [16])(lVar8 + lVar61 * (uVar67 + 3)));
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar256 = ZEXT1664(auVar75);
  auVar73 = vsubps_avx(auVar76,auVar73);
  auVar239 = ZEXT3264(_DAT_01f7b040);
  auVar101 = vbroadcastss_avx512vl(auVar3);
  auVar270 = ZEXT3264(auVar101);
  auVar97._8_4_ = 1;
  auVar97._0_8_ = 0x100000001;
  auVar97._12_4_ = 1;
  auVar97._16_4_ = 1;
  auVar97._20_4_ = 1;
  auVar97._24_4_ = 1;
  auVar97._28_4_ = 1;
  auVar102 = ZEXT1632(auVar3);
  auVar103 = vpermps_avx512vl(auVar97,auVar102);
  auVar271 = ZEXT3264(auVar103);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  auVar104 = vpermps_avx512vl(auVar109,auVar102);
  auVar110._8_4_ = 3;
  auVar110._0_8_ = 0x300000003;
  auVar110._12_4_ = 3;
  auVar110._16_4_ = 3;
  auVar110._20_4_ = 3;
  auVar110._24_4_ = 3;
  auVar110._28_4_ = 3;
  auVar102 = vpermps_avx512vl(auVar110,auVar102);
  auVar98 = vbroadcastss_avx512vl(auVar75);
  local_9a0 = ZEXT1632(auVar75);
  auVar99 = vpermps_avx512vl(auVar97,local_9a0);
  auVar100 = vpermps_avx512vl(auVar109,local_9a0);
  auVar93 = vpermps_avx512vl(auVar110,local_9a0);
  auVar94 = vbroadcastss_avx512vl(auVar72);
  local_980 = ZEXT1632(auVar72);
  auVar105 = vpermps_avx512vl(auVar97,local_980);
  local_5c0 = vpermps_avx512vl(auVar109,local_980);
  local_5e0 = vpermps_avx512vl(auVar110,local_980);
  local_600 = vbroadcastss_avx512vl(auVar73);
  _local_9c0 = ZEXT1632(auVar73);
  local_620 = vpermps_avx2(auVar97,_local_9c0);
  local_640 = vpermps_avx2(auVar109,_local_9c0);
  local_560 = vpermps_avx2(auVar110,_local_9c0);
  auVar137._16_48_ = auVar168._16_48_;
  auVar137._0_16_ = vmulss_avx512f(auVar83,auVar83);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar137._0_16_),local_860,local_860);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_840,local_840);
  local_580._0_4_ = auVar73._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  auVar84._16_4_ = 0x7fffffff;
  auVar84._20_4_ = 0x7fffffff;
  auVar84._24_4_ = 0x7fffffff;
  auVar84._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar84);
  local_5a0 = auVar137._0_32_;
  local_950 = ZEXT416((uint)local_660);
  local_660 = fVar2 - local_660;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  uVar67 = 0;
  bVar68 = 0;
  iVar66 = 1;
  auVar137 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar137);
  auVar73 = vsqrtss_avx(local_9e0,local_9e0);
  auVar72 = vsqrtss_avx(local_9e0,local_9e0);
  local_710 = ZEXT816(0x3f80000000000000);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar137 = ZEXT3264(auVar106);
  local_880 = auVar168._0_32_;
  do {
    auVar75 = vmovshdup_avx(local_710);
    auVar75 = vsubps_avx(auVar75,local_710);
    auVar151._0_4_ = auVar75._0_4_;
    fVar229 = auVar151._0_4_ * 0.04761905;
    uVar169 = local_710._0_4_;
    auVar232._4_4_ = uVar169;
    auVar232._0_4_ = uVar169;
    auVar232._8_4_ = uVar169;
    auVar232._12_4_ = uVar169;
    auVar232._16_4_ = uVar169;
    auVar232._20_4_ = uVar169;
    auVar232._24_4_ = uVar169;
    auVar232._28_4_ = uVar169;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar160._16_4_ = auVar151._0_4_;
    auVar160._0_16_ = auVar151;
    auVar160._20_4_ = auVar151._0_4_;
    auVar160._24_4_ = auVar151._0_4_;
    auVar160._28_4_ = auVar151._0_4_;
    auVar75 = vfmadd231ps_fma(auVar232,auVar160,auVar239._0_32_);
    auVar106 = vsubps_avx512vl(auVar137._0_32_,ZEXT1632(auVar75));
    fVar269 = auVar75._0_4_;
    fVar223 = auVar75._4_4_;
    fVar224 = auVar75._8_4_;
    fVar225 = auVar75._12_4_;
    fVar227 = auVar106._0_4_;
    fVar228 = auVar106._4_4_;
    fVar242 = auVar106._8_4_;
    fVar243 = auVar106._12_4_;
    fVar244 = auVar106._16_4_;
    fVar186 = auVar106._20_4_;
    fVar245 = auVar106._24_4_;
    auVar114._4_4_ = fVar228 * fVar228 * -fVar223;
    auVar114._0_4_ = fVar227 * fVar227 * -fVar269;
    auVar114._8_4_ = fVar242 * fVar242 * -fVar224;
    auVar114._12_4_ = fVar243 * fVar243 * -fVar225;
    auVar114._16_4_ = fVar244 * fVar244 * -0.0;
    auVar114._20_4_ = fVar186 * fVar186 * -0.0;
    auVar114._24_4_ = fVar245 * fVar245 * -0.0;
    auVar114._28_4_ = 0x80000000;
    auVar239._28_36_ = auVar251._28_36_;
    auVar239._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * fVar225,
                            CONCAT48(fVar224 * fVar224,CONCAT44(fVar223 * fVar223,fVar269 * fVar269)
                                    )));
    fVar252 = fVar269 * 3.0;
    fVar257 = fVar223 * 3.0;
    fVar258 = fVar224 * 3.0;
    fVar259 = fVar225 * 3.0;
    auVar251._28_36_ = auVar256._28_36_;
    auVar251._0_28_ = ZEXT1628(CONCAT412(fVar259,CONCAT48(fVar258,CONCAT44(fVar257,fVar252))));
    auVar181._0_4_ = (fVar252 + -5.0) * fVar269 * fVar269;
    auVar181._4_4_ = (fVar257 + -5.0) * fVar223 * fVar223;
    auVar181._8_4_ = (fVar258 + -5.0) * fVar224 * fVar224;
    auVar181._12_4_ = (fVar259 + -5.0) * fVar225 * fVar225;
    auVar181._16_4_ = 0x80000000;
    auVar181._20_4_ = 0x80000000;
    auVar181._24_4_ = 0x80000000;
    auVar181._28_4_ = 0;
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar84 = vaddps_avx512vl(auVar181,auVar107);
    auVar261._0_4_ = fVar227 * fVar227;
    auVar261._4_4_ = fVar228 * fVar228;
    auVar261._8_4_ = fVar242 * fVar242;
    auVar261._12_4_ = fVar243 * fVar243;
    auVar261._16_4_ = fVar244 * fVar244;
    auVar261._20_4_ = fVar186 * fVar186;
    auVar261._28_36_ = auVar260._28_36_;
    auVar261._24_4_ = fVar245 * fVar245;
    auVar117._4_4_ = auVar261._4_4_ * (fVar228 * 3.0 + -5.0);
    auVar117._0_4_ = auVar261._0_4_ * (fVar227 * 3.0 + -5.0);
    auVar117._8_4_ = auVar261._8_4_ * (fVar242 * 3.0 + -5.0);
    auVar117._12_4_ = auVar261._12_4_ * (fVar243 * 3.0 + -5.0);
    auVar117._16_4_ = auVar261._16_4_ * (fVar244 * 3.0 + -5.0);
    auVar117._20_4_ = auVar261._20_4_ * (fVar186 * 3.0 + -5.0);
    auVar117._24_4_ = auVar261._24_4_ * (fVar245 * 3.0 + -5.0);
    auVar117._28_4_ = auVar262._28_4_ + -5.0;
    auVar85 = vaddps_avx512vl(auVar117,auVar107);
    fVar226 = auVar106._28_4_;
    auVar118._4_4_ = fVar223 * fVar223 * -fVar228;
    auVar118._0_4_ = fVar269 * fVar269 * -fVar227;
    auVar118._8_4_ = fVar224 * fVar224 * -fVar242;
    auVar118._12_4_ = fVar225 * fVar225 * -fVar243;
    auVar118._16_4_ = -fVar244 * 0.0 * 0.0;
    auVar118._20_4_ = -fVar186 * 0.0 * 0.0;
    auVar118._24_4_ = -fVar245 * 0.0 * 0.0;
    auVar118._28_4_ = -fVar226;
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar106 = vmulps_avx512vl(auVar114,auVar86);
    auVar87 = vmulps_avx512vl(auVar84,auVar86);
    auVar85 = vmulps_avx512vl(auVar85,auVar86);
    auVar88 = vmulps_avx512vl(auVar118,auVar86);
    auVar89 = vmulps_avx512vl(local_600,auVar88);
    auVar119._4_4_ = local_620._4_4_ * auVar88._4_4_;
    auVar119._0_4_ = local_620._0_4_ * auVar88._0_4_;
    auVar119._8_4_ = local_620._8_4_ * auVar88._8_4_;
    auVar119._12_4_ = local_620._12_4_ * auVar88._12_4_;
    auVar119._16_4_ = local_620._16_4_ * auVar88._16_4_;
    auVar119._20_4_ = local_620._20_4_ * auVar88._20_4_;
    auVar119._24_4_ = local_620._24_4_ * auVar88._24_4_;
    auVar119._28_4_ = auVar84._28_4_;
    auVar120._4_4_ = local_640._4_4_ * auVar88._4_4_;
    auVar120._0_4_ = local_640._0_4_ * auVar88._0_4_;
    auVar120._8_4_ = local_640._8_4_ * auVar88._8_4_;
    auVar120._12_4_ = local_640._12_4_ * auVar88._12_4_;
    auVar120._16_4_ = local_640._16_4_ * auVar88._16_4_;
    auVar120._20_4_ = local_640._20_4_ * auVar88._20_4_;
    auVar120._24_4_ = local_640._24_4_ * auVar88._24_4_;
    auVar120._28_4_ = 0x80000000;
    auVar84 = vmulps_avx512vl(local_560,auVar88);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar94);
    auVar89 = vfmadd231ps_avx512vl(auVar119,auVar85,auVar105);
    auVar90 = vfmadd231ps_avx512vl(auVar120,auVar85,local_5c0);
    auVar84 = vfmadd231ps_avx512vl(auVar84,local_5e0,auVar85);
    auVar85 = vfmadd231ps_avx512vl(auVar88,auVar87,auVar98);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar99);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar100);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar93,auVar87);
    auVar90 = vfmadd231ps_avx512vl(auVar85,auVar106,auVar270._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar106,auVar271._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar106,auVar104);
    auVar85 = vfmadd231ps_avx512vl(auVar84,auVar102,auVar106);
    auVar121._4_4_ = (fVar228 + fVar228) * fVar223;
    auVar121._0_4_ = (fVar227 + fVar227) * fVar269;
    auVar121._8_4_ = (fVar242 + fVar242) * fVar224;
    auVar121._12_4_ = (fVar243 + fVar243) * fVar225;
    auVar121._16_4_ = (fVar244 + fVar244) * 0.0;
    auVar121._20_4_ = (fVar186 + fVar186) * 0.0;
    auVar121._24_4_ = (fVar245 + fVar245) * 0.0;
    auVar121._28_4_ = auVar87._28_4_;
    auVar106 = vsubps_avx(auVar121,auVar261._0_32_);
    auVar233._0_28_ =
         ZEXT1628(CONCAT412((fVar225 + fVar225) * (fVar259 + -5.0) + fVar259 * fVar225,
                            CONCAT48((fVar224 + fVar224) * (fVar258 + -5.0) + fVar258 * fVar224,
                                     CONCAT44((fVar223 + fVar223) * (fVar257 + -5.0) +
                                              fVar257 * fVar223,
                                              (fVar269 + fVar269) * (fVar252 + -5.0) +
                                              fVar252 * fVar269))));
    auVar233._28_4_ = auVar256._28_4_ + -5.0 + 0.0;
    auVar107 = vaddps_avx512vl(auVar251._0_32_,auVar107);
    auVar122._4_4_ = (fVar228 + fVar228) * auVar107._4_4_;
    auVar122._0_4_ = (fVar227 + fVar227) * auVar107._0_4_;
    auVar122._8_4_ = (fVar242 + fVar242) * auVar107._8_4_;
    auVar122._12_4_ = (fVar243 + fVar243) * auVar107._12_4_;
    auVar122._16_4_ = (fVar244 + fVar244) * auVar107._16_4_;
    auVar122._20_4_ = (fVar186 + fVar186) * auVar107._20_4_;
    auVar122._24_4_ = (fVar245 + fVar245) * auVar107._24_4_;
    auVar122._28_4_ = auVar107._28_4_;
    auVar125._4_4_ = fVar228 * 3.0 * fVar228;
    auVar125._0_4_ = fVar227 * 3.0 * fVar227;
    auVar125._8_4_ = fVar242 * 3.0 * fVar242;
    auVar125._12_4_ = fVar243 * 3.0 * fVar243;
    auVar125._16_4_ = fVar244 * 3.0 * fVar244;
    auVar125._20_4_ = fVar186 * 3.0 * fVar186;
    auVar125._24_4_ = fVar245 * 3.0 * fVar245;
    auVar125._28_4_ = fVar226;
    auVar107 = vsubps_avx(auVar122,auVar125);
    auVar84 = vsubps_avx(auVar239._0_32_,auVar121);
    auVar91 = vmulps_avx512vl(auVar106,auVar86);
    auVar92 = vmulps_avx512vl(auVar233,auVar86);
    auVar107 = vmulps_avx512vl(auVar107,auVar86);
    auVar84 = vmulps_avx512vl(auVar84,auVar86);
    auVar86 = vmulps_avx512vl(local_600,auVar84);
    auVar126._4_4_ = local_620._4_4_ * auVar84._4_4_;
    auVar126._0_4_ = local_620._0_4_ * auVar84._0_4_;
    auVar126._8_4_ = local_620._8_4_ * auVar84._8_4_;
    auVar126._12_4_ = local_620._12_4_ * auVar84._12_4_;
    auVar126._16_4_ = local_620._16_4_ * auVar84._16_4_;
    auVar126._20_4_ = local_620._20_4_ * auVar84._20_4_;
    auVar126._24_4_ = local_620._24_4_ * auVar84._24_4_;
    auVar126._28_4_ = auVar106._28_4_;
    auVar127._4_4_ = local_640._4_4_ * auVar84._4_4_;
    auVar127._0_4_ = local_640._0_4_ * auVar84._0_4_;
    auVar127._8_4_ = local_640._8_4_ * auVar84._8_4_;
    auVar127._12_4_ = local_640._12_4_ * auVar84._12_4_;
    auVar127._16_4_ = local_640._16_4_ * auVar84._16_4_;
    auVar127._20_4_ = local_640._20_4_ * auVar84._20_4_;
    auVar127._24_4_ = local_640._24_4_ * auVar84._24_4_;
    auVar127._28_4_ = auVar262._28_4_;
    auVar106 = vmulps_avx512vl(local_560,auVar84);
    auVar84 = vfmadd231ps_avx512vl(auVar86,auVar107,auVar94);
    auVar86 = vfmadd231ps_avx512vl(auVar126,auVar107,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar127,auVar107,local_5c0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_5e0,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar84,auVar92,auVar98);
    auVar84 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar99);
    auVar86 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar100);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar92);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar91,auVar270._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar91,auVar271._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar91);
    auVar37._4_4_ = auVar107._4_4_ * fVar229;
    auVar37._0_4_ = auVar107._0_4_ * fVar229;
    auVar37._8_4_ = auVar107._8_4_ * fVar229;
    auVar37._12_4_ = auVar107._12_4_ * fVar229;
    auVar37._16_4_ = auVar107._16_4_ * fVar229;
    auVar37._20_4_ = auVar107._20_4_ * fVar229;
    auVar37._24_4_ = auVar107._24_4_ * fVar229;
    auVar37._28_4_ = fVar226 + fVar226;
    auVar38._4_4_ = auVar84._4_4_ * fVar229;
    auVar38._0_4_ = auVar84._0_4_ * fVar229;
    auVar38._8_4_ = auVar84._8_4_ * fVar229;
    auVar38._12_4_ = auVar84._12_4_ * fVar229;
    auVar38._16_4_ = auVar84._16_4_ * fVar229;
    auVar38._20_4_ = auVar84._20_4_ * fVar229;
    auVar38._24_4_ = auVar84._24_4_ * fVar229;
    auVar38._28_4_ = auVar87._28_4_;
    auVar39._4_4_ = auVar86._4_4_ * fVar229;
    auVar39._0_4_ = auVar86._0_4_ * fVar229;
    auVar39._8_4_ = auVar86._8_4_ * fVar229;
    auVar39._12_4_ = auVar86._12_4_ * fVar229;
    auVar39._16_4_ = auVar86._16_4_ * fVar229;
    auVar39._20_4_ = auVar86._20_4_ * fVar229;
    auVar39._24_4_ = auVar86._24_4_ * fVar229;
    auVar39._28_4_ = 0;
    fVar269 = fVar229 * auVar106._0_4_;
    fVar223 = fVar229 * auVar106._4_4_;
    auVar40._4_4_ = fVar223;
    auVar40._0_4_ = fVar269;
    fVar224 = fVar229 * auVar106._8_4_;
    auVar40._8_4_ = fVar224;
    fVar225 = fVar229 * auVar106._12_4_;
    auVar40._12_4_ = fVar225;
    fVar226 = fVar229 * auVar106._16_4_;
    auVar40._16_4_ = fVar226;
    fVar227 = fVar229 * auVar106._20_4_;
    auVar40._20_4_ = fVar227;
    fVar228 = fVar229 * auVar106._24_4_;
    auVar40._24_4_ = fVar228;
    auVar40._28_4_ = fVar229;
    auVar75 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
    auVar87 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar91 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar75));
    auVar260 = ZEXT3264(auVar91);
    auVar84 = ZEXT1632(auVar75);
    auVar92 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,auVar84);
    auVar262 = ZEXT3264(auVar92);
    auVar234._0_4_ = auVar85._0_4_ + fVar269;
    auVar234._4_4_ = auVar85._4_4_ + fVar223;
    auVar234._8_4_ = auVar85._8_4_ + fVar224;
    auVar234._12_4_ = auVar85._12_4_ + fVar225;
    auVar234._16_4_ = auVar85._16_4_ + fVar226;
    auVar234._20_4_ = auVar85._20_4_ + fVar227;
    auVar234._24_4_ = auVar85._24_4_ + fVar228;
    auVar234._28_4_ = auVar85._28_4_ + fVar229;
    auVar106 = vmaxps_avx(auVar85,auVar234);
    auVar107 = vminps_avx(auVar85,auVar234);
    auVar95 = vpermt2ps_avx512vl(auVar85,_DAT_01fb9fc0,auVar84);
    auVar96 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar84);
    auVar97 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar84);
    auVar121 = ZEXT1632(auVar75);
    auVar108 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar121);
    auVar84 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar121);
    auVar109 = vsubps_avx512vl(auVar95,auVar84);
    auVar84 = vsubps_avx(auVar87,auVar90);
    auVar256 = ZEXT3264(auVar84);
    auVar85 = vsubps_avx(auVar91,auVar88);
    auVar251 = ZEXT3264(auVar85);
    auVar86 = vsubps_avx(auVar92,auVar89);
    auVar110 = vmulps_avx512vl(auVar85,auVar39);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar38,auVar86);
    auVar111 = vmulps_avx512vl(auVar86,auVar37);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar39,auVar84);
    auVar112 = vmulps_avx512vl(auVar84,auVar38);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar37,auVar85);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar86,auVar86);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar85,auVar85);
    auVar113 = vfmadd231ps_avx512vl(auVar111,auVar84,auVar84);
    auVar111 = vrcp14ps_avx512vl(auVar113);
    auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar137 = ZEXT3264(auVar114);
    auVar112 = vfnmadd213ps_avx512vl(auVar111,auVar113,auVar114);
    auVar111 = vfmadd132ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar110,auVar111);
    auVar112 = vmulps_avx512vl(auVar85,auVar108);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar97,auVar86);
    auVar115 = vmulps_avx512vl(auVar86,auVar96);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar108,auVar84);
    auVar116 = vmulps_avx512vl(auVar84,auVar97);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar96,auVar85);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar112 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar110 = vmaxps_avx512vl(auVar110,auVar111);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar111 = vmaxps_avx512vl(auVar109,auVar95);
    auVar106 = vmaxps_avx512vl(auVar106,auVar111);
    auVar116 = vaddps_avx512vl(auVar110,auVar106);
    auVar106 = vminps_avx512vl(auVar109,auVar95);
    auVar106 = vminps_avx(auVar107,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar110);
    auVar111._8_4_ = 0x3f800002;
    auVar111._0_8_ = 0x3f8000023f800002;
    auVar111._12_4_ = 0x3f800002;
    auVar111._16_4_ = 0x3f800002;
    auVar111._20_4_ = 0x3f800002;
    auVar111._24_4_ = 0x3f800002;
    auVar111._28_4_ = 0x3f800002;
    auVar107 = vmulps_avx512vl(auVar116,auVar111);
    auVar112._8_4_ = 0x3f7ffffc;
    auVar112._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar112._12_4_ = 0x3f7ffffc;
    auVar112._16_4_ = 0x3f7ffffc;
    auVar112._20_4_ = 0x3f7ffffc;
    auVar112._24_4_ = 0x3f7ffffc;
    auVar112._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar106,auVar112);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar95 = vrsqrt14ps_avx512vl(auVar113);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar113,auVar115);
    fVar229 = auVar95._0_4_;
    fVar269 = auVar95._4_4_;
    fVar223 = auVar95._8_4_;
    fVar224 = auVar95._12_4_;
    fVar225 = auVar95._16_4_;
    fVar226 = auVar95._20_4_;
    fVar227 = auVar95._24_4_;
    auVar41._4_4_ = fVar269 * fVar269 * fVar269 * auVar109._4_4_;
    auVar41._0_4_ = fVar229 * fVar229 * fVar229 * auVar109._0_4_;
    auVar41._8_4_ = fVar223 * fVar223 * fVar223 * auVar109._8_4_;
    auVar41._12_4_ = fVar224 * fVar224 * fVar224 * auVar109._12_4_;
    auVar41._16_4_ = fVar225 * fVar225 * fVar225 * auVar109._16_4_;
    auVar41._20_4_ = fVar226 * fVar226 * fVar226 * auVar109._20_4_;
    auVar41._24_4_ = fVar227 * fVar227 * fVar227 * auVar109._24_4_;
    auVar41._28_4_ = auVar116._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar41,auVar95,auVar113);
    auVar109 = vmulps_avx512vl(auVar84,auVar95);
    auVar110 = vmulps_avx512vl(auVar85,auVar95);
    auVar111 = vmulps_avx512vl(auVar86,auVar95);
    auVar112 = vsubps_avx512vl(auVar121,auVar90);
    auVar115 = vsubps_avx512vl(auVar121,auVar88);
    auVar113 = vsubps_avx512vl(auVar121,auVar89);
    auVar116 = vmulps_avx512vl(local_880,auVar113);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_860,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_840,auVar112);
    auVar117 = vmulps_avx512vl(auVar113,auVar113);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar118 = vmulps_avx512vl(local_880,auVar111);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar110,local_860);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,local_840);
    auVar111 = vmulps_avx512vl(auVar113,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar109);
    auVar110 = vmulps_avx512vl(auVar118,auVar118);
    auVar111 = vsubps_avx512vl(local_580,auVar110);
    auVar119 = vmulps_avx512vl(auVar118,auVar109);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar119 = vaddps_avx512vl(auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar109,auVar109);
    auVar117 = vsubps_avx512vl(auVar117,auVar116);
    auVar107 = vsubps_avx512vl(auVar117,auVar107);
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar111,auVar116);
    auVar116 = vmulps_avx512vl(_local_8a0,auVar107);
    auVar116 = vsubps_avx512vl(auVar120,auVar116);
    uVar70 = vcmpps_avx512vl(auVar116,auVar121,5);
    bVar57 = (byte)uVar70;
    if (bVar57 == 0) {
LAB_01ba6f6b:
      auVar239 = ZEXT3264(_DAT_01f7b040);
      auVar106 = vmovdqa64_avx512vl(auVar101);
      auVar270 = ZEXT3264(auVar106);
      auVar106 = vmovdqa64_avx512vl(auVar103);
      auVar271 = ZEXT3264(auVar106);
    }
    else {
      local_800._0_32_ = auVar117;
      auVar116 = vsqrtps_avx512vl(auVar116);
      auVar121 = vaddps_avx512vl(auVar111,auVar111);
      local_8c0 = vrcp14ps_avx512vl(auVar121);
      auVar114 = vfnmadd213ps_avx512vl(local_8c0,auVar121,auVar114);
      auVar114 = vfmadd132ps_avx512vl(auVar114,local_8c0,local_8c0);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      local_8e0 = vxorps_avx512vl(auVar119,auVar30);
      auVar122 = vsubps_avx512vl(local_8e0,auVar116);
      auVar122 = vmulps_avx512vl(auVar122,auVar114);
      auVar116 = vsubps_avx512vl(auVar116,auVar119);
      local_900 = vmulps_avx512vl(auVar116,auVar114);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar116,auVar122);
      auVar123._0_4_ =
           (uint)(bVar57 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar116._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar69 * auVar114._4_4_ | (uint)!bVar69 * auVar116._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar69 * auVar114._8_4_ | (uint)!bVar69 * auVar116._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar69 * auVar114._12_4_ | (uint)!bVar69 * auVar116._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar69 * auVar114._16_4_ | (uint)!bVar69 * auVar116._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar69 * auVar114._20_4_ | (uint)!bVar69 * auVar116._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar69 * auVar114._24_4_ | (uint)!bVar69 * auVar116._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar123._28_4_ = (uint)bVar69 * auVar114._28_4_ | (uint)!bVar69 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar116,local_900);
      auVar124._0_4_ =
           (uint)(bVar57 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar116._0_4_;
      bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar69 * auVar114._4_4_ | (uint)!bVar69 * auVar116._4_4_;
      bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar69 * auVar114._8_4_ | (uint)!bVar69 * auVar116._8_4_;
      bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar69 * auVar114._12_4_ | (uint)!bVar69 * auVar116._12_4_;
      bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar69 * auVar114._16_4_ | (uint)!bVar69 * auVar116._16_4_;
      bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar69 * auVar114._20_4_ | (uint)!bVar69 * auVar116._20_4_;
      bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar69 * auVar114._24_4_ | (uint)!bVar69 * auVar116._24_4_;
      bVar69 = SUB81(uVar70 >> 7,0);
      auVar124._28_4_ = (uint)bVar69 * auVar114._28_4_ | (uint)!bVar69 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar116);
      local_a00 = vmaxps_avx512vl(local_5a0,auVar116);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_a20 = vmulps_avx512vl(local_a00,auVar31);
      vandps_avx512vl(auVar111,auVar116);
      uVar63 = vcmpps_avx512vl(local_a20,local_a20,1);
      uVar70 = uVar70 & uVar63;
      bVar64 = (byte)uVar70;
      if (bVar64 != 0) {
        uVar63 = vcmpps_avx512vl(auVar107,_DAT_01f7b000,2);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar111 = vblendmps_avx512vl(auVar107,auVar110);
        bVar60 = (byte)uVar63;
        uVar71 = (uint)(bVar60 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar60 & 1) * local_a20._0_4_;
        bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar144 = (uint)bVar69 * auVar111._4_4_ | (uint)!bVar69 * local_a20._4_4_;
        bVar69 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar145 = (uint)bVar69 * auVar111._8_4_ | (uint)!bVar69 * local_a20._8_4_;
        bVar69 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar146 = (uint)bVar69 * auVar111._12_4_ | (uint)!bVar69 * local_a20._12_4_;
        bVar69 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar147 = (uint)bVar69 * auVar111._16_4_ | (uint)!bVar69 * local_a20._16_4_;
        bVar69 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar148 = (uint)bVar69 * auVar111._20_4_ | (uint)!bVar69 * local_a20._20_4_;
        bVar69 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar149 = (uint)bVar69 * auVar111._24_4_ | (uint)!bVar69 * local_a20._24_4_;
        bVar69 = SUB81(uVar63 >> 7,0);
        uVar150 = (uint)bVar69 * auVar111._28_4_ | (uint)!bVar69 * local_a20._28_4_;
        auVar123._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar123._0_4_;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar123._4_4_ = bVar69 * uVar144 | !bVar69 * auVar123._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar123._8_4_ = bVar69 * uVar145 | !bVar69 * auVar123._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar123._12_4_ = bVar69 * uVar146 | !bVar69 * auVar123._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar123._16_4_ = bVar69 * uVar147 | !bVar69 * auVar123._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar123._20_4_ = bVar69 * uVar148 | !bVar69 * auVar123._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar123._24_4_ = bVar69 * uVar149 | !bVar69 * auVar123._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar123._28_4_ = bVar69 * uVar150 | !bVar69 * auVar123._28_4_;
        auVar107 = vblendmps_avx512vl(auVar110,auVar107);
        bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar17 = SUB81(uVar63 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar60 & 1) * auVar107._0_4_ | !(bool)(bVar60 & 1) * uVar71) |
             !(bool)(bVar64 & 1) * auVar124._0_4_;
        bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar11 * ((uint)bVar69 * auVar107._4_4_ | !bVar69 * uVar144) |
             !bVar11 * auVar124._4_4_;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar69 * ((uint)bVar12 * auVar107._8_4_ | !bVar12 * uVar145) |
             !bVar69 * auVar124._8_4_;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar69 * ((uint)bVar13 * auVar107._12_4_ | !bVar13 * uVar146) |
             !bVar69 * auVar124._12_4_;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar69 * ((uint)bVar14 * auVar107._16_4_ | !bVar14 * uVar147) |
             !bVar69 * auVar124._16_4_;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar69 * ((uint)bVar15 * auVar107._20_4_ | !bVar15 * uVar148) |
             !bVar69 * auVar124._20_4_;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar69 * ((uint)bVar16 * auVar107._24_4_ | !bVar16 * uVar149) |
             !bVar69 * auVar124._24_4_;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar69 * ((uint)bVar17 * auVar107._28_4_ | !bVar17 * uVar150) |
             !bVar69 * auVar124._28_4_;
        bVar57 = (~bVar64 | bVar60) & bVar57;
      }
      if ((bVar57 & 0x7f) == 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar137 = ZEXT3264(auVar106);
        goto LAB_01ba6f6b;
      }
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar108 = vxorps_avx512vl(auVar108,auVar107);
      auVar96 = vxorps_avx512vl(auVar96,auVar107);
      auVar168 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
      auVar97 = vxorps_avx512vl(auVar97,auVar107);
      auVar75 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                               ZEXT416((uint)local_950._0_4_));
      auVar110 = vbroadcastss_avx512vl(auVar75);
      auVar110 = vminps_avx512vl(auVar110,auVar124);
      auVar56._4_4_ = fStack_65c;
      auVar56._0_4_ = local_660;
      auVar56._8_4_ = fStack_658;
      auVar56._12_4_ = fStack_654;
      auVar56._16_4_ = fStack_650;
      auVar56._20_4_ = fStack_64c;
      auVar56._24_4_ = fStack_648;
      auVar56._28_4_ = fStack_644;
      auVar111 = vmaxps_avx512vl(auVar56,auVar123);
      auVar113 = vmulps_avx512vl(auVar113,auVar39);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar38,auVar113);
      auVar75 = vfmadd213ps_fma(auVar112,auVar37,auVar115);
      auVar112 = vmulps_avx512vl(local_880,auVar39);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_860,auVar38);
      auVar112 = vfmadd231ps_avx512vl(auVar112,local_840,auVar37);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar115);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar115,auVar113,1);
      auVar116 = vxorps_avx512vl(ZEXT1632(auVar75),auVar107);
      auVar114 = vrcp14ps_avx512vl(auVar112);
      auVar125 = vxorps_avx512vl(auVar112,auVar107);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar127 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar126);
      auVar75 = vfmadd132ps_fma(auVar127,auVar114,auVar114);
      fVar229 = auVar75._0_4_ * auVar116._0_4_;
      fVar269 = auVar75._4_4_ * auVar116._4_4_;
      auVar42._4_4_ = fVar269;
      auVar42._0_4_ = fVar229;
      fVar223 = auVar75._8_4_ * auVar116._8_4_;
      auVar42._8_4_ = fVar223;
      fVar224 = auVar75._12_4_ * auVar116._12_4_;
      auVar42._12_4_ = fVar224;
      fVar225 = auVar116._16_4_ * 0.0;
      auVar42._16_4_ = fVar225;
      fVar226 = auVar116._20_4_ * 0.0;
      auVar42._20_4_ = fVar226;
      fVar227 = auVar116._24_4_ * 0.0;
      auVar42._24_4_ = fVar227;
      auVar42._28_4_ = auVar116._28_4_;
      uVar20 = vcmpps_avx512vl(auVar112,auVar125,1);
      bVar64 = (byte)uVar18 | (byte)uVar20;
      auVar268._8_4_ = 0xff800000;
      auVar268._0_8_ = 0xff800000ff800000;
      auVar268._12_4_ = 0xff800000;
      auVar268._16_4_ = 0xff800000;
      auVar268._20_4_ = 0xff800000;
      auVar268._24_4_ = 0xff800000;
      auVar268._28_4_ = 0xff800000;
      auVar127 = vblendmps_avx512vl(auVar42,auVar268);
      auVar128._0_4_ =
           (uint)(bVar64 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar114._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar69 * auVar127._4_4_ | (uint)!bVar69 * auVar114._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar69 * auVar127._8_4_ | (uint)!bVar69 * auVar114._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar69 * auVar127._12_4_ | (uint)!bVar69 * auVar114._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar69 * auVar127._16_4_ | (uint)!bVar69 * auVar114._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar69 * auVar127._20_4_ | (uint)!bVar69 * auVar114._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar69 * auVar127._24_4_ | (uint)!bVar69 * auVar114._24_4_;
      auVar128._28_4_ =
           (uint)(bVar64 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar114._28_4_;
      auVar111 = vmaxps_avx512vl(auVar111,auVar128);
      uVar20 = vcmpps_avx512vl(auVar112,auVar125,6);
      bVar64 = (byte)uVar18 | (byte)uVar20;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar129._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar229;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar69 * auVar112._4_4_ | (uint)!bVar69 * (int)fVar269;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar69 * auVar112._8_4_ | (uint)!bVar69 * (int)fVar223;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar69 * auVar112._12_4_ | (uint)!bVar69 * (int)fVar224;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar69 * auVar112._16_4_ | (uint)!bVar69 * (int)fVar225;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar69 * auVar112._20_4_ | (uint)!bVar69 * (int)fVar226;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar69 * auVar112._24_4_ | (uint)!bVar69 * (int)fVar227;
      auVar129._28_4_ =
           (uint)(bVar64 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar116._28_4_;
      auVar116 = vminps_avx512vl(auVar110,auVar129);
      auVar76 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
      auVar87 = vsubps_avx512vl(ZEXT1632(auVar76),auVar87);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar76),auVar91);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar76),auVar92);
      auVar92 = vmulps_avx512vl(auVar92,auVar108);
      auVar91 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar87);
      auVar91 = vmulps_avx512vl(local_880,auVar108);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_860,auVar97);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_840,auVar96);
      vandps_avx512vl(auVar91,auVar115);
      auVar137 = ZEXT3264(auVar126);
      uVar18 = vcmpps_avx512vl(auVar91,auVar113,1);
      auVar87 = vxorps_avx512vl(auVar87,auVar107);
      auVar92 = vrcp14ps_avx512vl(auVar91);
      auVar96 = vxorps_avx512vl(auVar91,auVar107);
      auVar262 = ZEXT3264(auVar96);
      auVar107 = vfnmadd213ps_avx512vl(auVar92,auVar91,auVar126);
      auVar75 = vfmadd132ps_fma(auVar107,auVar92,auVar92);
      fVar229 = auVar75._0_4_ * auVar87._0_4_;
      fVar269 = auVar75._4_4_ * auVar87._4_4_;
      auVar43._4_4_ = fVar269;
      auVar43._0_4_ = fVar229;
      fVar223 = auVar75._8_4_ * auVar87._8_4_;
      auVar43._8_4_ = fVar223;
      fVar224 = auVar75._12_4_ * auVar87._12_4_;
      auVar43._12_4_ = fVar224;
      fVar225 = auVar87._16_4_ * 0.0;
      auVar43._16_4_ = fVar225;
      fVar226 = auVar87._20_4_ * 0.0;
      auVar43._20_4_ = fVar226;
      fVar227 = auVar87._24_4_ * 0.0;
      auVar43._24_4_ = fVar227;
      auVar43._28_4_ = auVar87._28_4_;
      uVar20 = vcmpps_avx512vl(auVar91,auVar96,1);
      bVar64 = (byte)uVar18 | (byte)uVar20;
      auVar107 = vblendmps_avx512vl(auVar43,auVar268);
      auVar130._0_4_ =
           (uint)(bVar64 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar92._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * auVar92._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * auVar92._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * auVar92._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * auVar92._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * auVar92._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * auVar92._24_4_;
      auVar130._28_4_ =
           (uint)(bVar64 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar92._28_4_;
      auVar107 = vmaxps_avx(auVar111,auVar130);
      auVar260 = ZEXT3264(auVar107);
      uVar20 = vcmpps_avx512vl(auVar91,auVar96,6);
      bVar64 = (byte)uVar18 | (byte)uVar20;
      auVar131._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar229;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar69 * auVar112._4_4_ | (uint)!bVar69 * (int)fVar269;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar69 * auVar112._8_4_ | (uint)!bVar69 * (int)fVar223;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar69 * auVar112._12_4_ | (uint)!bVar69 * (int)fVar224;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar69 * auVar112._16_4_ | (uint)!bVar69 * (int)fVar225;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar69 * auVar112._20_4_ | (uint)!bVar69 * (int)fVar226;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar69 * auVar112._24_4_ | (uint)!bVar69 * (int)fVar227;
      auVar131._28_4_ =
           (uint)(bVar64 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar87._28_4_;
      local_6c0 = vminps_avx(auVar116,auVar131);
      uVar18 = vcmpps_avx512vl(auVar107,local_6c0,2);
      bVar57 = bVar57 & 0x7f & (byte)uVar18;
      if (bVar57 == 0) goto LAB_01ba6f6b;
      auVar87 = vmaxps_avx512vl(ZEXT1632(auVar76),auVar106);
      auVar106 = vfmadd213ps_avx512vl(auVar122,auVar118,auVar109);
      fVar229 = auVar95._0_4_;
      fVar269 = auVar95._4_4_;
      auVar44._4_4_ = fVar269 * auVar106._4_4_;
      auVar44._0_4_ = fVar229 * auVar106._0_4_;
      fVar223 = auVar95._8_4_;
      auVar44._8_4_ = fVar223 * auVar106._8_4_;
      fVar224 = auVar95._12_4_;
      auVar44._12_4_ = fVar224 * auVar106._12_4_;
      fVar225 = auVar95._16_4_;
      auVar44._16_4_ = fVar225 * auVar106._16_4_;
      fVar226 = auVar95._20_4_;
      auVar44._20_4_ = fVar226 * auVar106._20_4_;
      fVar227 = auVar95._24_4_;
      auVar44._24_4_ = fVar227 * auVar106._24_4_;
      auVar44._28_4_ = auVar106._28_4_;
      auVar106 = vfmadd213ps_avx512vl(local_900,auVar118,auVar109);
      auVar45._4_4_ = fVar269 * auVar106._4_4_;
      auVar45._0_4_ = fVar229 * auVar106._0_4_;
      auVar45._8_4_ = fVar223 * auVar106._8_4_;
      auVar45._12_4_ = fVar224 * auVar106._12_4_;
      auVar45._16_4_ = fVar225 * auVar106._16_4_;
      auVar45._20_4_ = fVar226 * auVar106._20_4_;
      auVar45._24_4_ = fVar227 * auVar106._24_4_;
      auVar45._28_4_ = auVar106._28_4_;
      auVar106 = vminps_avx512vl(auVar44,auVar126);
      auVar91 = ZEXT832(0) << 0x20;
      auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
      auVar92 = vminps_avx512vl(auVar45,auVar126);
      auVar46._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar106._28_4_ + 7.0;
      local_520 = vfmadd213ps_avx512vl(auVar46,auVar160,auVar232);
      auVar106 = vmaxps_avx(auVar92,ZEXT832(0) << 0x20);
      auVar47._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar106._28_4_ + 7.0;
      local_540 = vfmadd213ps_avx512vl(auVar47,auVar160,auVar232);
      auVar48._4_4_ = auVar87._4_4_ * auVar87._4_4_;
      auVar48._0_4_ = auVar87._0_4_ * auVar87._0_4_;
      auVar48._8_4_ = auVar87._8_4_ * auVar87._8_4_;
      auVar48._12_4_ = auVar87._12_4_ * auVar87._12_4_;
      auVar48._16_4_ = auVar87._16_4_ * auVar87._16_4_;
      auVar48._20_4_ = auVar87._20_4_ * auVar87._20_4_;
      auVar48._24_4_ = auVar87._24_4_ * auVar87._24_4_;
      auVar48._28_4_ = auVar87._28_4_;
      auVar106 = vsubps_avx(auVar117,auVar48);
      auVar49._4_4_ = auVar106._4_4_ * (float)local_8a0._4_4_;
      auVar49._0_4_ = auVar106._0_4_ * (float)local_8a0._0_4_;
      auVar49._8_4_ = auVar106._8_4_ * fStack_898;
      auVar49._12_4_ = auVar106._12_4_ * fStack_894;
      auVar49._16_4_ = auVar106._16_4_ * fStack_890;
      auVar49._20_4_ = auVar106._20_4_ * fStack_88c;
      auVar49._24_4_ = auVar106._24_4_ * fStack_888;
      auVar49._28_4_ = auVar87._28_4_;
      auVar87 = vsubps_avx(auVar120,auVar49);
      uVar18 = vcmpps_avx512vl(auVar87,ZEXT832(0) << 0x20,5);
      bVar64 = (byte)uVar18;
      if (bVar64 == 0) {
        bVar64 = 0;
        auVar84 = ZEXT832(0) << 0x20;
        auVar137 = ZEXT864(0) << 0x20;
        auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar92 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar260 = ZEXT864(0) << 0x20;
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar132._16_4_ = 0x7f800000;
        auVar132._20_4_ = 0x7f800000;
        auVar132._24_4_ = 0x7f800000;
        auVar132._28_4_ = 0x7f800000;
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
      }
      else {
        auVar76 = vxorps_avx512vl(auVar151,auVar151);
        uVar70 = vcmpps_avx512vl(auVar87,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar87 = vsqrtps_avx(auVar87);
        auVar91 = vfnmadd213ps_avx512vl(auVar121,local_8c0,auVar126);
        auVar96 = vfmadd132ps_avx512vl(auVar91,local_8c0,local_8c0);
        auVar91 = vsubps_avx(local_8e0,auVar87);
        auVar97 = vmulps_avx512vl(auVar91,auVar96);
        auVar87 = vsubps_avx512vl(auVar87,auVar119);
        auVar96 = vmulps_avx512vl(auVar87,auVar96);
        auVar87 = vfmadd213ps_avx512vl(auVar118,auVar97,auVar109);
        auVar50._4_4_ = fVar269 * auVar87._4_4_;
        auVar50._0_4_ = fVar229 * auVar87._0_4_;
        auVar50._8_4_ = fVar223 * auVar87._8_4_;
        auVar50._12_4_ = fVar224 * auVar87._12_4_;
        auVar50._16_4_ = fVar225 * auVar87._16_4_;
        auVar50._20_4_ = fVar226 * auVar87._20_4_;
        auVar50._24_4_ = fVar227 * auVar87._24_4_;
        auVar50._28_4_ = auVar92._28_4_;
        auVar87 = vmulps_avx512vl(local_840,auVar97);
        auVar91 = vmulps_avx512vl(local_860,auVar97);
        auVar108 = vmulps_avx512vl(local_880,auVar97);
        auVar92 = vfmadd213ps_avx512vl(auVar84,auVar50,auVar90);
        auVar87 = vsubps_avx512vl(auVar87,auVar92);
        auVar92 = vfmadd213ps_avx512vl(auVar85,auVar50,auVar88);
        auVar92 = vsubps_avx512vl(auVar91,auVar92);
        auVar75 = vfmadd213ps_fma(auVar50,auVar86,auVar89);
        auVar91 = vsubps_avx(auVar108,ZEXT1632(auVar75));
        auVar260 = ZEXT3264(auVar91);
        auVar91 = vfmadd213ps_avx512vl(auVar118,auVar96,auVar109);
        auVar95 = vmulps_avx512vl(auVar95,auVar91);
        auVar91 = vmulps_avx512vl(local_840,auVar96);
        auVar108 = vmulps_avx512vl(local_860,auVar96);
        auVar109 = vmulps_avx512vl(local_880,auVar96);
        auVar75 = vfmadd213ps_fma(auVar84,auVar95,auVar90);
        auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar85,auVar95,auVar88);
        auVar84 = vsubps_avx512vl(auVar108,ZEXT1632(auVar75));
        auVar75 = vfmadd213ps_fma(auVar86,auVar95,auVar89);
        auVar85 = vsubps_avx512vl(auVar109,ZEXT1632(auVar75));
        auVar137 = ZEXT3264(auVar85);
        auVar161._8_4_ = 0x7f800000;
        auVar161._0_8_ = 0x7f8000007f800000;
        auVar161._12_4_ = 0x7f800000;
        auVar161._16_4_ = 0x7f800000;
        auVar161._20_4_ = 0x7f800000;
        auVar161._24_4_ = 0x7f800000;
        auVar161._28_4_ = 0x7f800000;
        auVar85 = vblendmps_avx512vl(auVar161,auVar97);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar132._0_4_ = (uint)bVar69 * auVar85._0_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar69 * auVar85._16_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar69 * auVar85._20_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar69 * auVar85._24_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar132._28_4_ = (uint)bVar69 * auVar85._28_4_ | (uint)!bVar69 * 0x7f800000;
        auVar204._8_4_ = 0xff800000;
        auVar204._0_8_ = 0xff800000ff800000;
        auVar204._12_4_ = 0xff800000;
        auVar204._16_4_ = 0xff800000;
        auVar204._20_4_ = 0xff800000;
        auVar204._24_4_ = 0xff800000;
        auVar204._28_4_ = 0xff800000;
        auVar85 = vblendmps_avx512vl(auVar204,auVar96);
        bVar69 = (bool)((byte)uVar70 & 1);
        auVar133._0_4_ = (uint)bVar69 * auVar85._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar69 * auVar85._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar69 * auVar85._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar69 * auVar85._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar70 >> 7,0);
        auVar133._28_4_ = (uint)bVar69 * auVar85._28_4_ | (uint)!bVar69 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar85 = vmulps_avx512vl(local_a00,auVar32);
        uVar63 = vcmpps_avx512vl(auVar85,local_a20,0xe);
        uVar70 = uVar70 & uVar63;
        bVar60 = (byte)uVar70;
        if (bVar60 != 0) {
          uVar63 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar76),2);
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
          auVar106 = vblendmps_avx512vl(auVar255,auVar265);
          bVar58 = (byte)uVar63;
          uVar71 = (uint)(bVar58 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar85._0_4_;
          bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
          uVar144 = (uint)bVar69 * auVar106._4_4_ | (uint)!bVar69 * auVar85._4_4_;
          bVar69 = (bool)((byte)(uVar63 >> 2) & 1);
          uVar145 = (uint)bVar69 * auVar106._8_4_ | (uint)!bVar69 * auVar85._8_4_;
          bVar69 = (bool)((byte)(uVar63 >> 3) & 1);
          uVar146 = (uint)bVar69 * auVar106._12_4_ | (uint)!bVar69 * auVar85._12_4_;
          bVar69 = (bool)((byte)(uVar63 >> 4) & 1);
          uVar147 = (uint)bVar69 * auVar106._16_4_ | (uint)!bVar69 * auVar85._16_4_;
          bVar69 = (bool)((byte)(uVar63 >> 5) & 1);
          uVar148 = (uint)bVar69 * auVar106._20_4_ | (uint)!bVar69 * auVar85._20_4_;
          bVar69 = (bool)((byte)(uVar63 >> 6) & 1);
          uVar149 = (uint)bVar69 * auVar106._24_4_ | (uint)!bVar69 * auVar85._24_4_;
          bVar69 = SUB81(uVar63 >> 7,0);
          uVar150 = (uint)bVar69 * auVar106._28_4_ | (uint)!bVar69 * auVar85._28_4_;
          auVar132._0_4_ = (bVar60 & 1) * uVar71 | !(bool)(bVar60 & 1) * auVar132._0_4_;
          bVar69 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar132._4_4_ = bVar69 * uVar144 | !bVar69 * auVar132._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar132._8_4_ = bVar69 * uVar145 | !bVar69 * auVar132._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar132._12_4_ = bVar69 * uVar146 | !bVar69 * auVar132._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar132._16_4_ = bVar69 * uVar147 | !bVar69 * auVar132._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar132._20_4_ = bVar69 * uVar148 | !bVar69 * auVar132._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar132._24_4_ = bVar69 * uVar149 | !bVar69 * auVar132._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar132._28_4_ = bVar69 * uVar150 | !bVar69 * auVar132._28_4_;
          auVar106 = vblendmps_avx512vl(auVar265,auVar255);
          bVar69 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 4) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar63 >> 6) & 1);
          bVar17 = SUB81(uVar63 >> 7,0);
          auVar133._0_4_ =
               (uint)(bVar60 & 1) *
               ((uint)(bVar58 & 1) * auVar106._0_4_ | !(bool)(bVar58 & 1) * uVar71) |
               !(bool)(bVar60 & 1) * auVar133._0_4_;
          bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar133._4_4_ =
               (uint)bVar11 * ((uint)bVar69 * auVar106._4_4_ | !bVar69 * uVar144) |
               !bVar11 * auVar133._4_4_;
          bVar69 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar133._8_4_ =
               (uint)bVar69 * ((uint)bVar12 * auVar106._8_4_ | !bVar12 * uVar145) |
               !bVar69 * auVar133._8_4_;
          bVar69 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar133._12_4_ =
               (uint)bVar69 * ((uint)bVar13 * auVar106._12_4_ | !bVar13 * uVar146) |
               !bVar69 * auVar133._12_4_;
          bVar69 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar133._16_4_ =
               (uint)bVar69 * ((uint)bVar14 * auVar106._16_4_ | !bVar14 * uVar147) |
               !bVar69 * auVar133._16_4_;
          bVar69 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar133._20_4_ =
               (uint)bVar69 * ((uint)bVar15 * auVar106._20_4_ | !bVar15 * uVar148) |
               !bVar69 * auVar133._20_4_;
          bVar69 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar133._24_4_ =
               (uint)bVar69 * ((uint)bVar16 * auVar106._24_4_ | !bVar16 * uVar149) |
               !bVar69 * auVar133._24_4_;
          bVar69 = SUB81(uVar70 >> 7,0);
          auVar133._28_4_ =
               (uint)bVar69 * ((uint)bVar17 * auVar106._28_4_ | !bVar17 * uVar150) |
               !bVar69 * auVar133._28_4_;
          bVar64 = (~bVar60 | bVar58) & bVar64;
        }
      }
      auVar106 = vmovdqa64_avx512vl(auVar101);
      auVar270 = ZEXT3264(auVar106);
      auVar106 = vmovdqa64_avx512vl(auVar103);
      auVar271 = ZEXT3264(auVar106);
      auVar256._0_4_ = local_880._0_4_ * auVar137._0_4_;
      auVar256._4_4_ = local_880._4_4_ * auVar137._4_4_;
      auVar256._8_4_ = local_880._8_4_ * auVar137._8_4_;
      auVar256._12_4_ = local_880._12_4_ * auVar137._12_4_;
      auVar256._16_4_ = local_880._16_4_ * auVar137._16_4_;
      auVar256._20_4_ = local_880._20_4_ * auVar137._20_4_;
      auVar256._28_36_ = auVar137._28_36_;
      auVar256._24_4_ = local_880._24_4_ * auVar137._24_4_;
      auVar75 = vfmadd231ps_fma(auVar256._0_32_,local_860,auVar84);
      auVar256 = ZEXT3264(local_840);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),local_840,auVar91);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar251 = ZEXT3264(auVar250);
      auVar106 = vandps_avx(ZEXT1632(auVar75),auVar250);
      auVar262 = ZEXT3264(auVar107);
      _local_440 = auVar107;
      auVar241._8_4_ = 0x3e99999a;
      auVar241._0_8_ = 0x3e99999a3e99999a;
      auVar241._12_4_ = 0x3e99999a;
      auVar241._16_4_ = 0x3e99999a;
      auVar241._20_4_ = 0x3e99999a;
      auVar241._24_4_ = 0x3e99999a;
      auVar241._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar106,auVar241,1);
      _local_760 = vmaxps_avx(auVar107,auVar133);
      auVar106 = vminps_avx(local_6c0,auVar132);
      uVar20 = vcmpps_avx512vl(auVar107,auVar106,2);
      bVar60 = (byte)uVar20 & bVar57;
      uVar19 = vcmpps_avx512vl(_local_760,local_6c0,2);
      if ((bVar57 & ((byte)uVar19 | (byte)uVar20)) != 0) {
        bVar58 = (byte)uVar18 | ~bVar64;
        auVar51._4_4_ = local_880._4_4_ * auVar260._4_4_;
        auVar51._0_4_ = local_880._0_4_ * auVar260._0_4_;
        auVar51._8_4_ = local_880._8_4_ * auVar260._8_4_;
        auVar51._12_4_ = local_880._12_4_ * auVar260._12_4_;
        auVar51._16_4_ = local_880._16_4_ * auVar260._16_4_;
        auVar51._20_4_ = local_880._20_4_ * auVar260._20_4_;
        auVar51._24_4_ = local_880._24_4_ * auVar260._24_4_;
        auVar51._28_4_ = auVar106._28_4_;
        auVar75 = vfmadd213ps_fma(auVar92,local_860,auVar51);
        auVar75 = vfmadd213ps_fma(auVar87,local_840,ZEXT1632(auVar75));
        auVar106 = vandps_avx(ZEXT1632(auVar75),auVar250);
        uVar18 = vcmpps_avx512vl(auVar106,auVar241,1);
        bVar64 = (byte)uVar18 | ~bVar64;
        auVar162._8_4_ = 2;
        auVar162._0_8_ = 0x200000002;
        auVar162._12_4_ = 2;
        auVar162._16_4_ = 2;
        auVar162._20_4_ = 2;
        auVar162._24_4_ = 2;
        auVar162._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar106 = vpblendmd_avx512vl(auVar162,auVar33);
        local_6a0._0_4_ = (uint)(bVar64 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar69 = (bool)(bVar64 >> 1 & 1);
        local_6a0._4_4_ = (uint)bVar69 * auVar106._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 2 & 1);
        local_6a0._8_4_ = (uint)bVar69 * auVar106._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 3 & 1);
        local_6a0._12_4_ = (uint)bVar69 * auVar106._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 4 & 1);
        local_6a0._16_4_ = (uint)bVar69 * auVar106._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 5 & 1);
        local_6a0._20_4_ = (uint)bVar69 * auVar106._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 6 & 1);
        local_6a0._24_4_ = (uint)bVar69 * auVar106._24_4_ | (uint)!bVar69 * 2;
        local_6a0._28_4_ = (uint)(bVar64 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        local_700 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_700,local_6a0,5);
        local_740 = auVar107._0_4_ + (float)local_820._0_4_;
        fStack_73c = auVar107._4_4_ + (float)local_820._4_4_;
        fStack_738 = auVar107._8_4_ + fStack_818;
        fStack_734 = auVar107._12_4_ + fStack_814;
        fStack_730 = auVar107._16_4_ + fStack_810;
        fStack_72c = auVar107._20_4_ + fStack_80c;
        fStack_728 = auVar107._24_4_ + fStack_808;
        fStack_724 = auVar107._28_4_ + fStack_804;
        _local_6e0 = _local_760;
        for (bVar64 = (byte)uVar18 & bVar60; auVar106 = _local_6e0, bVar64 != 0;
            bVar64 = ~bVar62 & bVar64 & (byte)uVar18) {
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar106 = vblendmps_avx512vl(auVar163,auVar107);
          auVar134._0_4_ =
               (uint)(bVar64 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 1 & 1);
          auVar134._4_4_ = (uint)bVar69 * auVar106._4_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 2 & 1);
          auVar134._8_4_ = (uint)bVar69 * auVar106._8_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 3 & 1);
          auVar134._12_4_ = (uint)bVar69 * auVar106._12_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 4 & 1);
          auVar134._16_4_ = (uint)bVar69 * auVar106._16_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 5 & 1);
          auVar134._20_4_ = (uint)bVar69 * auVar106._20_4_ | (uint)!bVar69 * 0x7f800000;
          auVar134._24_4_ =
               (uint)(bVar64 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
          auVar134._28_4_ = 0x7f800000;
          auVar106 = vshufps_avx(auVar134,auVar134,0xb1);
          auVar106 = vminps_avx(auVar134,auVar106);
          auVar84 = vshufpd_avx(auVar106,auVar106,5);
          auVar106 = vminps_avx(auVar106,auVar84);
          auVar84 = vpermpd_avx2(auVar106,0x4e);
          auVar106 = vminps_avx(auVar106,auVar84);
          uVar18 = vcmpps_avx512vl(auVar134,auVar106,0);
          bVar59 = (byte)uVar18 & bVar64;
          bVar62 = bVar64;
          if (bVar59 != 0) {
            bVar62 = bVar59;
          }
          iVar21 = 0;
          for (uVar71 = (uint)bVar62; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar62 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar71 = *(uint *)(local_520 + (uint)(iVar21 << 2));
          uVar144 = *(uint *)(local_440 + (uint)(iVar21 << 2));
          fVar229 = auVar72._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar260 = ZEXT1664(auVar260._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            fVar229 = sqrtf((float)local_9e0._0_4_);
            auVar106 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar106);
            auVar106 = vmovdqa64_avx512vl(auVar101);
            auVar270 = ZEXT3264(auVar106);
          }
          auVar251 = ZEXT464(uVar144);
          uVar70 = (ulong)bVar62;
          auVar76 = vminps_avx(auVar3,local_9a0._0_16_);
          auVar75 = vmaxps_avx(auVar3,local_9a0._0_16_);
          auVar4 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar74 = vminps_avx(auVar76,auVar4);
          auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar4 = vmaxps_avx(auVar75,auVar76);
          auVar208._8_4_ = 0x7fffffff;
          auVar208._0_8_ = 0x7fffffff7fffffff;
          auVar208._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar74,auVar208);
          auVar76 = vandps_avx(auVar4,auVar208);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar269 = auVar75._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar4,auVar4,0xff);
          auVar75 = vinsertps_avx(ZEXT416(uVar144),ZEXT416(uVar71),0x10);
          auVar168 = ZEXT1664(auVar75);
          uVar63 = 0;
          while( true ) {
            bVar59 = (byte)uVar70;
            if (uVar63 == 5) break;
            uVar169 = auVar168._0_4_;
            auVar152._4_4_ = uVar169;
            auVar152._0_4_ = uVar169;
            auVar152._8_4_ = uVar169;
            auVar152._12_4_ = uVar169;
            auVar75 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_9d0);
            auVar76 = vmovshdup_avx(auVar168._0_16_);
            fVar242 = auVar76._0_4_;
            fVar228 = 1.0 - fVar242;
            fVar223 = fVar242 * fVar242;
            auVar78 = SUB6416(ZEXT464(0x40400000),0);
            auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar74 = vfmadd213ss_fma(auVar78,auVar76,auVar77);
            auVar4 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x40000000),0));
            auVar83 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar228),auVar77);
            auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar228 * fVar228)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar224 = fVar228 * fVar228 * -fVar242 * 0.5;
            fVar225 = auVar4._0_4_ * 0.5;
            fVar226 = auVar83._0_4_ * 0.5;
            fVar227 = fVar242 * fVar242 * -fVar228 * 0.5;
            auVar209._0_4_ = fVar227 * (float)local_9c0._0_4_;
            auVar209._4_4_ = fVar227 * (float)local_9c0._4_4_;
            auVar209._8_4_ = fVar227 * fStack_9b8;
            auVar209._12_4_ = fVar227 * fStack_9b4;
            auVar230._4_4_ = fVar226;
            auVar230._0_4_ = fVar226;
            auVar230._8_4_ = fVar226;
            auVar230._12_4_ = fVar226;
            auVar4 = vfmadd132ps_fma(auVar230,auVar209,local_980._0_16_);
            auVar188._4_4_ = fVar225;
            auVar188._0_4_ = fVar225;
            auVar188._8_4_ = fVar225;
            auVar188._12_4_ = fVar225;
            auVar4 = vfmadd132ps_fma(auVar188,auVar4,local_9a0._0_16_);
            auVar210._4_4_ = fVar224;
            auVar210._0_4_ = fVar224;
            auVar210._8_4_ = fVar224;
            auVar210._12_4_ = fVar224;
            auVar4 = vfmadd132ps_fma(auVar210,auVar4,auVar3);
            auVar83 = vfmadd231ss_fma(auVar77,auVar76,ZEXT416(0x41100000));
            local_8c0._0_16_ = auVar83;
            auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,ZEXT416(0x40800000));
            local_8e0._0_16_ = auVar83;
            auVar83 = vfmadd213ss_fma(auVar78,auVar76,ZEXT416(0xbf800000));
            local_900._0_16_ = auVar83;
            _local_8a0 = auVar4;
            auVar4 = vsubps_avx(auVar75,auVar4);
            auVar75 = vdpps_avx(auVar4,auVar4,0x7f);
            fVar224 = auVar75._0_4_;
            local_800 = auVar168;
            if (fVar224 < 0.0) {
              local_a00._0_4_ = fVar223;
              local_a20._0_4_ = fVar228 * -2.0;
              auVar262._0_4_ = sqrtf(fVar224);
              auVar262._4_60_ = extraout_var;
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar83 = auVar262._0_16_;
              uVar70 = extraout_RAX;
            }
            else {
              auVar83 = vsqrtss_avx(auVar75,auVar75);
              local_a20._0_4_ = fVar228 * -2.0;
              local_a00._0_4_ = fVar223;
            }
            auVar79 = vfnmadd231ss_fma(ZEXT416((uint)(fVar242 * (fVar228 + fVar228))),
                                       ZEXT416((uint)fVar228),ZEXT416((uint)fVar228));
            auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)(fVar242 + fVar242)),
                                      ZEXT416((uint)(fVar242 * fVar242 * 3.0)));
            auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * fVar228 * -3.0)),
                                      ZEXT416((uint)(fVar228 + fVar228)),auVar77);
            auVar77 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar76,
                                      ZEXT416((uint)local_a00._0_4_));
            fVar223 = auVar79._0_4_ * 0.5;
            fVar225 = auVar74._0_4_ * 0.5;
            fVar226 = auVar78._0_4_ * 0.5;
            fVar227 = auVar77._0_4_ * 0.5;
            auVar211._0_4_ = fVar227 * (float)local_9c0._0_4_;
            auVar211._4_4_ = fVar227 * (float)local_9c0._4_4_;
            auVar211._8_4_ = fVar227 * fStack_9b8;
            auVar211._12_4_ = fVar227 * fStack_9b4;
            auVar189._4_4_ = fVar226;
            auVar189._0_4_ = fVar226;
            auVar189._8_4_ = fVar226;
            auVar189._12_4_ = fVar226;
            auVar74 = vfmadd132ps_fma(auVar189,auVar211,local_980._0_16_);
            auVar170._4_4_ = fVar225;
            auVar170._0_4_ = fVar225;
            auVar170._8_4_ = fVar225;
            auVar170._12_4_ = fVar225;
            auVar74 = vfmadd132ps_fma(auVar170,auVar74,local_9a0._0_16_);
            auVar263._4_4_ = fVar223;
            auVar263._0_4_ = fVar223;
            auVar263._8_4_ = fVar223;
            auVar263._12_4_ = fVar223;
            auVar74 = vfmadd132ps_fma(auVar263,auVar74,auVar3);
            local_a00._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
            auVar52._12_4_ = 0;
            auVar52._0_12_ = ZEXT812(0);
            fVar223 = local_a00._0_4_;
            auVar77 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar223));
            fVar225 = auVar77._0_4_;
            local_a20._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar223));
            auVar22._8_4_ = 0x80000000;
            auVar22._0_8_ = 0x8000000080000000;
            auVar22._12_4_ = 0x80000000;
            auVar78 = vxorps_avx512vl(local_a00._0_16_,auVar22);
            auVar77 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar71 = auVar83._0_4_;
            if (fVar223 < auVar78._0_4_) {
              fVar226 = sqrtf(fVar223);
              auVar83 = ZEXT416(uVar71);
              uVar70 = extraout_RAX_00;
            }
            else {
              auVar78 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
              fVar226 = auVar78._0_4_;
            }
            fVar223 = fVar225 * 1.5 + fVar223 * -0.5 * fVar225 * fVar225 * fVar225;
            auVar153._0_4_ = auVar74._0_4_ * fVar223;
            auVar153._4_4_ = auVar74._4_4_ * fVar223;
            auVar153._8_4_ = auVar74._8_4_ * fVar223;
            auVar153._12_4_ = auVar74._12_4_ * fVar223;
            auVar78 = vdpps_avx(auVar4,auVar153,0x7f);
            fVar228 = auVar83._0_4_;
            fVar225 = auVar78._0_4_;
            auVar154._0_4_ = fVar225 * fVar225;
            auVar154._4_4_ = auVar78._4_4_ * auVar78._4_4_;
            auVar154._8_4_ = auVar78._8_4_ * auVar78._8_4_;
            auVar154._12_4_ = auVar78._12_4_ * auVar78._12_4_;
            auVar79 = vsubps_avx512vl(auVar75,auVar154);
            fVar227 = auVar79._0_4_;
            auVar171._4_12_ = ZEXT812(0) << 0x20;
            auVar171._0_4_ = fVar227;
            auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
            auVar81 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
            if (fVar227 < 0.0) {
              local_930 = fVar223;
              fStack_92c = fVar223;
              fStack_928 = fVar223;
              fStack_924 = fVar223;
              local_920 = auVar80;
              fVar227 = sqrtf(fVar227);
              auVar81 = ZEXT416(auVar81._0_4_);
              auVar83 = ZEXT416(uVar71);
              uVar70 = extraout_RAX_01;
              auVar79 = local_920;
              fVar223 = local_930;
              fVar242 = fStack_92c;
              fVar243 = fStack_928;
              fVar244 = fStack_924;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar227 = auVar79._0_4_;
              auVar79 = auVar80;
              fVar242 = fVar223;
              fVar243 = fVar223;
              fVar244 = fVar223;
            }
            auVar260 = ZEXT1664(auVar4);
            auVar106 = vmovdqa64_avx512vl(auVar101);
            auVar270 = ZEXT3264(auVar106);
            auVar106 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar106);
            auVar172._0_4_ = (float)local_900._0_4_ * (float)local_9c0._0_4_;
            auVar172._4_4_ = (float)local_900._0_4_ * (float)local_9c0._4_4_;
            auVar172._8_4_ = (float)local_900._0_4_ * fStack_9b8;
            auVar172._12_4_ = (float)local_900._0_4_ * fStack_9b4;
            auVar190._4_4_ = local_8e0._0_4_;
            auVar190._0_4_ = local_8e0._0_4_;
            auVar190._8_4_ = local_8e0._0_4_;
            auVar190._12_4_ = local_8e0._0_4_;
            auVar187 = vfmadd132ps_fma(auVar190,auVar172,local_980._0_16_);
            auVar173._4_4_ = local_8c0._0_4_;
            auVar173._0_4_ = local_8c0._0_4_;
            auVar173._8_4_ = local_8c0._0_4_;
            auVar173._12_4_ = local_8c0._0_4_;
            auVar187 = vfmadd132ps_fma(auVar173,auVar187,local_9a0._0_16_);
            auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar169 = auVar76._0_4_;
            auVar191._4_4_ = uVar169;
            auVar191._0_4_ = uVar169;
            auVar191._8_4_ = uVar169;
            auVar191._12_4_ = uVar169;
            auVar76 = vfmadd132ps_fma(auVar191,auVar187,auVar3);
            auVar174._0_4_ = auVar76._0_4_ * (float)local_a00._0_4_;
            auVar174._4_4_ = auVar76._4_4_ * (float)local_a00._0_4_;
            auVar174._8_4_ = auVar76._8_4_ * (float)local_a00._0_4_;
            auVar174._12_4_ = auVar76._12_4_ * (float)local_a00._0_4_;
            auVar76 = vdpps_avx(auVar74,auVar76,0x7f);
            fVar186 = auVar76._0_4_;
            auVar192._0_4_ = auVar74._0_4_ * fVar186;
            auVar192._4_4_ = auVar74._4_4_ * fVar186;
            auVar192._8_4_ = auVar74._8_4_ * fVar186;
            auVar192._12_4_ = auVar74._12_4_ * fVar186;
            auVar76 = vsubps_avx(auVar174,auVar192);
            fVar186 = auVar77._0_4_ * (float)local_a20._0_4_;
            auVar187 = vmaxss_avx(ZEXT416((uint)fVar269),
                                  ZEXT416((uint)(local_800._0_4_ * fVar229 * 1.9073486e-06)));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar139._16_48_ = local_800._16_48_;
            auVar82 = vxorps_avx512vl(auVar74,auVar23);
            auVar193._0_4_ = fVar223 * auVar76._0_4_ * fVar186;
            auVar193._4_4_ = fVar242 * auVar76._4_4_ * fVar186;
            auVar193._8_4_ = fVar243 * auVar76._8_4_ * fVar186;
            auVar193._12_4_ = fVar244 * auVar76._12_4_ * fVar186;
            auVar262 = ZEXT1664(auVar153);
            auVar76 = vdpps_avx(auVar82,auVar153,0x7f);
            auVar77 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar269),auVar187);
            auVar83 = vdpps_avx(auVar4,auVar193,0x7f);
            auVar207 = vfmadd213ss_fma(ZEXT416((uint)(fVar228 + 1.0)),
                                       ZEXT416((uint)(fVar269 / fVar226)),auVar77);
            fVar223 = auVar76._0_4_ + auVar83._0_4_;
            auVar76 = vdpps_avx(local_9d0,auVar153,0x7f);
            auVar83 = vdpps_avx(auVar4,auVar82,0x7f);
            auVar77 = vmulss_avx512f(auVar81,auVar79);
            fVar226 = auVar80._0_4_ * 1.5 + auVar77._0_4_ * auVar79._0_4_ * auVar79._0_4_;
            auVar77 = vdpps_avx(auVar4,local_9d0,0x7f);
            auVar80 = vfnmadd231ss_fma(auVar83,auVar78,ZEXT416((uint)fVar223));
            auVar77 = vfnmadd231ss_fma(auVar77,auVar78,auVar76);
            auVar83 = vpermilps_avx(_local_8a0,0xff);
            fVar227 = fVar227 - auVar83._0_4_;
            auVar79 = vshufps_avx(auVar74,auVar74,0xff);
            auVar83 = vfmsub213ss_fma(auVar80,ZEXT416((uint)fVar226),auVar79);
            auVar253._8_4_ = 0x80000000;
            auVar253._0_8_ = 0x8000000080000000;
            auVar253._12_4_ = 0x80000000;
            auVar256 = ZEXT1664(auVar253);
            auVar248._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
            auVar248._8_4_ = auVar83._8_4_ ^ 0x80000000;
            auVar248._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar251 = ZEXT1664(auVar248);
            auVar77 = ZEXT416((uint)(auVar77._0_4_ * fVar226));
            auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),
                                      ZEXT416((uint)fVar223),auVar77);
            auVar83 = vinsertps_avx(auVar248,auVar77,0x1c);
            auVar235._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar235._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar235._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar77 = vinsertps_avx(ZEXT416((uint)fVar223),auVar235,0x10);
            auVar212._0_4_ = auVar80._0_4_;
            auVar212._4_4_ = auVar212._0_4_;
            auVar212._8_4_ = auVar212._0_4_;
            auVar212._12_4_ = auVar212._0_4_;
            auVar76 = vdivps_avx(auVar83,auVar212);
            auVar83 = vdivps_avx(auVar77,auVar212);
            auVar213._0_4_ = fVar225 * auVar76._0_4_ + fVar227 * auVar83._0_4_;
            auVar213._4_4_ = fVar225 * auVar76._4_4_ + fVar227 * auVar83._4_4_;
            auVar213._8_4_ = fVar225 * auVar76._8_4_ + fVar227 * auVar83._8_4_;
            auVar213._12_4_ = fVar225 * auVar76._12_4_ + fVar227 * auVar83._12_4_;
            auVar76 = vsubps_avx(local_800._0_16_,auVar213);
            auVar168 = ZEXT1664(auVar76);
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx512vl(auVar78,auVar24);
            if (auVar83._0_4_ < auVar207._0_4_) {
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar207._0_4_ + auVar187._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar227),auVar25);
              if (auVar77._0_4_ < auVar83._0_4_) {
                bVar69 = uVar63 < 5;
                fVar229 = auVar76._0_4_ + (float)local_950._0_4_;
                if ((fVar2 <= fVar229) &&
                   (fVar269 = *(float *)(ray + k * 4 + 0x200), fVar229 <= fVar269)) {
                  auVar76 = vmovshdup_avx(auVar76);
                  bVar59 = 0;
                  if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01ba7999;
                  auVar214._0_12_ = ZEXT812(0);
                  auVar214._12_4_ = 0;
                  auVar139._0_16_ = auVar214;
                  auVar138._4_60_ = auVar139._4_60_;
                  auVar138._0_4_ = fVar224;
                  auVar76 = vrsqrt14ss_avx512f(auVar214,auVar138._0_16_);
                  fVar223 = auVar76._0_4_;
                  auVar75 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
                  pGVar6 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar59 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ba7999;
                    fVar223 = fVar223 * 1.5 + auVar75._0_4_ * fVar223 * fVar223 * fVar223;
                    auVar194._0_4_ = auVar4._0_4_ * fVar223;
                    auVar194._4_4_ = auVar4._4_4_ * fVar223;
                    auVar194._8_4_ = auVar4._8_4_ * fVar223;
                    auVar194._12_4_ = auVar4._12_4_ * fVar223;
                    auVar83 = vfmadd213ps_fma(auVar79,auVar194,auVar74);
                    auVar75 = vshufps_avx(auVar194,auVar194,0xc9);
                    auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar195._0_4_ = auVar194._0_4_ * auVar76._0_4_;
                    auVar195._4_4_ = auVar194._4_4_ * auVar76._4_4_;
                    auVar195._8_4_ = auVar194._8_4_ * auVar76._8_4_;
                    auVar195._12_4_ = auVar194._12_4_ * auVar76._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar195,auVar74,auVar75);
                    auVar75 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar76 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                    auVar155._0_4_ = auVar83._0_4_ * auVar74._0_4_;
                    auVar155._4_4_ = auVar83._4_4_ * auVar74._4_4_;
                    auVar155._8_4_ = auVar83._8_4_ * auVar74._8_4_;
                    auVar155._12_4_ = auVar83._12_4_ * auVar74._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar155,auVar75,auVar76);
                    auVar137 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar137,auVar168);
                    auVar168 = vpermps_avx512f(auVar137,ZEXT1664(auVar75));
                    auVar137 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar137,ZEXT1664(auVar75));
                    local_380 = vbroadcastss_avx512f(auVar75);
                    local_400[0] = (RTCHitN)auVar168[0];
                    local_400[1] = (RTCHitN)auVar168[1];
                    local_400[2] = (RTCHitN)auVar168[2];
                    local_400[3] = (RTCHitN)auVar168[3];
                    local_400[4] = (RTCHitN)auVar168[4];
                    local_400[5] = (RTCHitN)auVar168[5];
                    local_400[6] = (RTCHitN)auVar168[6];
                    local_400[7] = (RTCHitN)auVar168[7];
                    local_400[8] = (RTCHitN)auVar168[8];
                    local_400[9] = (RTCHitN)auVar168[9];
                    local_400[10] = (RTCHitN)auVar168[10];
                    local_400[0xb] = (RTCHitN)auVar168[0xb];
                    local_400[0xc] = (RTCHitN)auVar168[0xc];
                    local_400[0xd] = (RTCHitN)auVar168[0xd];
                    local_400[0xe] = (RTCHitN)auVar168[0xe];
                    local_400[0xf] = (RTCHitN)auVar168[0xf];
                    local_400[0x10] = (RTCHitN)auVar168[0x10];
                    local_400[0x11] = (RTCHitN)auVar168[0x11];
                    local_400[0x12] = (RTCHitN)auVar168[0x12];
                    local_400[0x13] = (RTCHitN)auVar168[0x13];
                    local_400[0x14] = (RTCHitN)auVar168[0x14];
                    local_400[0x15] = (RTCHitN)auVar168[0x15];
                    local_400[0x16] = (RTCHitN)auVar168[0x16];
                    local_400[0x17] = (RTCHitN)auVar168[0x17];
                    local_400[0x18] = (RTCHitN)auVar168[0x18];
                    local_400[0x19] = (RTCHitN)auVar168[0x19];
                    local_400[0x1a] = (RTCHitN)auVar168[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar168[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar168[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar168[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar168[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar168[0x1f];
                    local_400[0x20] = (RTCHitN)auVar168[0x20];
                    local_400[0x21] = (RTCHitN)auVar168[0x21];
                    local_400[0x22] = (RTCHitN)auVar168[0x22];
                    local_400[0x23] = (RTCHitN)auVar168[0x23];
                    local_400[0x24] = (RTCHitN)auVar168[0x24];
                    local_400[0x25] = (RTCHitN)auVar168[0x25];
                    local_400[0x26] = (RTCHitN)auVar168[0x26];
                    local_400[0x27] = (RTCHitN)auVar168[0x27];
                    local_400[0x28] = (RTCHitN)auVar168[0x28];
                    local_400[0x29] = (RTCHitN)auVar168[0x29];
                    local_400[0x2a] = (RTCHitN)auVar168[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar168[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar168[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar168[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar168[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar168[0x2f];
                    local_400[0x30] = (RTCHitN)auVar168[0x30];
                    local_400[0x31] = (RTCHitN)auVar168[0x31];
                    local_400[0x32] = (RTCHitN)auVar168[0x32];
                    local_400[0x33] = (RTCHitN)auVar168[0x33];
                    local_400[0x34] = (RTCHitN)auVar168[0x34];
                    local_400[0x35] = (RTCHitN)auVar168[0x35];
                    local_400[0x36] = (RTCHitN)auVar168[0x36];
                    local_400[0x37] = (RTCHitN)auVar168[0x37];
                    local_400[0x38] = (RTCHitN)auVar168[0x38];
                    local_400[0x39] = (RTCHitN)auVar168[0x39];
                    local_400[0x3a] = (RTCHitN)auVar168[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar168[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar168[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar168[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar168[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar168[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar168 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar168);
                    vpcmpeqd_avx2(auVar168._0_32_,auVar168._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar229;
                    auVar168 = vmovdqa64_avx512f(local_500);
                    local_7c0 = vmovdqa64_avx512f(auVar168);
                    local_a50.valid = (int *)local_7c0;
                    local_a50.geometryUserPtr = pGVar6->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_400;
                    local_a50.N = 0x10;
                    local_a50.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar251 = ZEXT1664(auVar248);
                      auVar256 = ZEXT1664(auVar253);
                      auVar260 = ZEXT1664(auVar4);
                      auVar262 = ZEXT1664(auVar153);
                      (*pGVar6->occlusionFilterN)(&local_a50);
                      auVar106 = vmovdqa64_avx512vl(auVar103);
                      auVar271 = ZEXT3264(auVar106);
                      auVar106 = vmovdqa64_avx512vl(auVar101);
                      auVar270 = ZEXT3264(auVar106);
                      auVar168 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar18 = vptestmd_avx512f(auVar168,auVar168);
                    if ((short)uVar18 != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        (*p_Var10)(&local_a50);
                        auVar106 = vmovdqa64_avx512vl(auVar103);
                        auVar271 = ZEXT3264(auVar106);
                        auVar106 = vmovdqa64_avx512vl(auVar101);
                        auVar270 = ZEXT3264(auVar106);
                        auVar168 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar70 = vptestmd_avx512f(auVar168,auVar168);
                      auVar168 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar11 = (bool)((byte)uVar70 & 1);
                      auVar140._0_4_ =
                           (uint)bVar11 * auVar168._0_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x200);
                      bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar140._4_4_ =
                           (uint)bVar11 * auVar168._4_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x204);
                      bVar11 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar140._8_4_ =
                           (uint)bVar11 * auVar168._8_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x208);
                      bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar140._12_4_ =
                           (uint)bVar11 * auVar168._12_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x20c);
                      bVar11 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar140._16_4_ =
                           (uint)bVar11 * auVar168._16_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x210);
                      bVar11 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar140._20_4_ =
                           (uint)bVar11 * auVar168._20_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x214);
                      bVar11 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar140._24_4_ =
                           (uint)bVar11 * auVar168._24_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x218);
                      bVar11 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar140._28_4_ =
                           (uint)bVar11 * auVar168._28_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x21c);
                      bVar11 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar140._32_4_ =
                           (uint)bVar11 * auVar168._32_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x220);
                      bVar11 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar140._36_4_ =
                           (uint)bVar11 * auVar168._36_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x224);
                      bVar11 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar140._40_4_ =
                           (uint)bVar11 * auVar168._40_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x228);
                      bVar11 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar140._44_4_ =
                           (uint)bVar11 * auVar168._44_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x22c);
                      bVar11 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar140._48_4_ =
                           (uint)bVar11 * auVar168._48_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x230);
                      bVar11 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar140._52_4_ =
                           (uint)bVar11 * auVar168._52_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x234);
                      bVar11 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar140._56_4_ =
                           (uint)bVar11 * auVar168._56_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x238);
                      bVar11 = SUB81(uVar70 >> 0xf,0);
                      auVar140._60_4_ =
                           (uint)bVar11 * auVar168._60_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar140;
                      bVar59 = 1;
                      if ((short)uVar70 != 0) goto LAB_01ba7999;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar269;
                    bVar59 = 0;
                    goto LAB_01ba7999;
                  }
                }
                bVar59 = 0;
                goto LAB_01ba7999;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar69 = false;
LAB_01ba7999:
          bVar68 = bVar68 | bVar69 & bVar59;
          uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar237._4_4_ = uVar169;
          auVar237._0_4_ = uVar169;
          auVar237._8_4_ = uVar169;
          auVar237._12_4_ = uVar169;
          auVar237._16_4_ = uVar169;
          auVar237._20_4_ = uVar169;
          auVar237._24_4_ = uVar169;
          auVar237._28_4_ = uVar169;
          auVar168 = ZEXT3264(auVar237);
          auVar54._4_4_ = fStack_73c;
          auVar54._0_4_ = local_740;
          auVar54._8_4_ = fStack_738;
          auVar54._12_4_ = fStack_734;
          auVar54._16_4_ = fStack_730;
          auVar54._20_4_ = fStack_72c;
          auVar54._24_4_ = fStack_728;
          auVar54._28_4_ = fStack_724;
          uVar18 = vcmpps_avx512vl(auVar237,auVar54,0xd);
        }
        auVar164._0_4_ = (float)local_820._0_4_ + (float)local_760._0_4_;
        auVar164._4_4_ = (float)local_820._4_4_ + (float)local_760._4_4_;
        auVar164._8_4_ = fStack_818 + fStack_758;
        auVar164._12_4_ = fStack_814 + fStack_754;
        auVar164._16_4_ = fStack_810 + fStack_750;
        auVar164._20_4_ = fStack_80c + fStack_74c;
        auVar164._24_4_ = fStack_808 + fStack_748;
        auVar164._28_4_ = fStack_804 + fStack_744;
        uVar169 = auVar168._0_4_;
        auVar182._4_4_ = uVar169;
        auVar182._0_4_ = uVar169;
        auVar182._8_4_ = uVar169;
        auVar182._12_4_ = uVar169;
        auVar182._16_4_ = uVar169;
        auVar182._20_4_ = uVar169;
        auVar182._24_4_ = uVar169;
        auVar182._28_4_ = uVar169;
        uVar18 = vcmpps_avx512vl(auVar164,auVar182,2);
        auVar165._8_4_ = 2;
        auVar165._0_8_ = 0x200000002;
        auVar165._12_4_ = 2;
        auVar165._16_4_ = 2;
        auVar165._20_4_ = 2;
        auVar165._24_4_ = 2;
        auVar165._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar107 = vpblendmd_avx512vl(auVar165,auVar34);
        local_760._0_4_ = (uint)(bVar58 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
        bVar69 = (bool)(bVar58 >> 1 & 1);
        local_760._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar58 >> 2 & 1);
        fStack_758 = (float)((uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar58 >> 3 & 1);
        fStack_754 = (float)((uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar58 >> 4 & 1);
        fStack_750 = (float)((uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar58 >> 5 & 1);
        fStack_74c = (float)((uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * 2);
        bVar69 = (bool)(bVar58 >> 6 & 1);
        fStack_748 = (float)((uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * 2);
        fStack_744 = (float)((uint)(bVar58 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2)
        ;
        bVar57 = (byte)uVar19 & bVar57 & (byte)uVar18;
        uVar18 = vpcmpd_avx512vl(_local_760,local_700,2);
        local_740 = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        fStack_73c = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        fStack_738 = fStack_818 + fStack_6d8;
        fStack_734 = fStack_814 + fStack_6d4;
        fStack_730 = fStack_810 + fStack_6d0;
        fStack_72c = fStack_80c + fStack_6cc;
        fStack_728 = fStack_808 + fStack_6c8;
        fStack_724 = fStack_804 + fStack_6c4;
        for (bVar64 = (byte)uVar18 & bVar57; bVar64 != 0; bVar64 = ~bVar58 & bVar64 & (byte)uVar18)
        {
          auVar166._8_4_ = 0x7f800000;
          auVar166._0_8_ = 0x7f8000007f800000;
          auVar166._12_4_ = 0x7f800000;
          auVar166._16_4_ = 0x7f800000;
          auVar166._20_4_ = 0x7f800000;
          auVar166._24_4_ = 0x7f800000;
          auVar166._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar166,auVar106);
          auVar135._0_4_ =
               (uint)(bVar64 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 1 & 1);
          auVar135._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 2 & 1);
          auVar135._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 3 & 1);
          auVar135._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 4 & 1);
          auVar135._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * 0x7f800000;
          bVar69 = (bool)(bVar64 >> 5 & 1);
          auVar135._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * 0x7f800000;
          auVar135._24_4_ =
               (uint)(bVar64 >> 6) * auVar107._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
          auVar135._28_4_ = 0x7f800000;
          auVar107 = vshufps_avx(auVar135,auVar135,0xb1);
          auVar107 = vminps_avx(auVar135,auVar107);
          auVar84 = vshufpd_avx(auVar107,auVar107,5);
          auVar107 = vminps_avx(auVar107,auVar84);
          auVar84 = vpermpd_avx2(auVar107,0x4e);
          auVar107 = vminps_avx(auVar107,auVar84);
          uVar18 = vcmpps_avx512vl(auVar135,auVar107,0);
          bVar62 = (byte)uVar18 & bVar64;
          bVar58 = bVar64;
          if (bVar62 != 0) {
            bVar58 = bVar62;
          }
          iVar21 = 0;
          for (uVar71 = (uint)bVar58; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
            iVar21 = iVar21 + 1;
          }
          bVar58 = '\x01' << ((byte)iVar21 & 0x1f);
          uVar71 = *(uint *)(local_540 + (uint)(iVar21 << 2));
          uVar144 = *(uint *)(local_6c0 + (uint)(iVar21 << 2));
          fVar229 = auVar73._0_4_;
          if ((float)local_9e0._0_4_ < 0.0) {
            auVar256 = ZEXT1664(auVar256._0_16_);
            auVar260 = ZEXT1664(auVar260._0_16_);
            auVar262 = ZEXT1664(auVar262._0_16_);
            fVar229 = sqrtf((float)local_9e0._0_4_);
            auVar107 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar107);
            auVar107 = vmovdqa64_avx512vl(auVar101);
            auVar270 = ZEXT3264(auVar107);
          }
          auVar251 = ZEXT464(uVar144);
          uVar70 = (ulong)bVar58;
          auVar76 = vminps_avx(auVar3,local_9a0._0_16_);
          auVar75 = vmaxps_avx(auVar3,local_9a0._0_16_);
          auVar4 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar74 = vminps_avx(auVar76,auVar4);
          auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
          auVar4 = vmaxps_avx(auVar75,auVar76);
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar74,auVar215);
          auVar76 = vandps_avx(auVar4,auVar215);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar269 = auVar75._0_4_ * 1.9073486e-06;
          local_940 = vshufps_avx(auVar4,auVar4,0xff);
          auVar75 = vinsertps_avx(ZEXT416(uVar144),ZEXT416(uVar71),0x10);
          auVar168 = ZEXT1664(auVar75);
          uVar63 = 0;
          while( true ) {
            bVar62 = (byte)uVar70;
            if (uVar63 == 5) break;
            uVar169 = auVar168._0_4_;
            auVar156._4_4_ = uVar169;
            auVar156._0_4_ = uVar169;
            auVar156._8_4_ = uVar169;
            auVar156._12_4_ = uVar169;
            auVar75 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_9d0);
            auVar76 = vmovshdup_avx(auVar168._0_16_);
            fVar242 = auVar76._0_4_;
            fVar228 = 1.0 - fVar242;
            fVar223 = fVar242 * fVar242;
            auVar78 = SUB6416(ZEXT464(0x40400000),0);
            auVar77 = SUB6416(ZEXT464(0xc0a00000),0);
            auVar74 = vfmadd213ss_fma(auVar78,auVar76,auVar77);
            auVar4 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x40000000),0));
            auVar83 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar228),auVar77);
            auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar228 * fVar228)),
                                      SUB6416(ZEXT464(0x40000000),0));
            fVar224 = fVar228 * fVar228 * -fVar242 * 0.5;
            fVar225 = auVar4._0_4_ * 0.5;
            fVar226 = auVar83._0_4_ * 0.5;
            fVar227 = fVar242 * fVar242 * -fVar228 * 0.5;
            auVar216._0_4_ = fVar227 * (float)local_9c0._0_4_;
            auVar216._4_4_ = fVar227 * (float)local_9c0._4_4_;
            auVar216._8_4_ = fVar227 * fStack_9b8;
            auVar216._12_4_ = fVar227 * fStack_9b4;
            auVar231._4_4_ = fVar226;
            auVar231._0_4_ = fVar226;
            auVar231._8_4_ = fVar226;
            auVar231._12_4_ = fVar226;
            auVar4 = vfmadd132ps_fma(auVar231,auVar216,local_980._0_16_);
            auVar196._4_4_ = fVar225;
            auVar196._0_4_ = fVar225;
            auVar196._8_4_ = fVar225;
            auVar196._12_4_ = fVar225;
            auVar4 = vfmadd132ps_fma(auVar196,auVar4,local_9a0._0_16_);
            auVar217._4_4_ = fVar224;
            auVar217._0_4_ = fVar224;
            auVar217._8_4_ = fVar224;
            auVar217._12_4_ = fVar224;
            auVar4 = vfmadd132ps_fma(auVar217,auVar4,auVar3);
            auVar83 = vfmadd231ss_fma(auVar77,auVar76,ZEXT416(0x41100000));
            local_8c0._0_16_ = auVar83;
            auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,ZEXT416(0x40800000));
            local_8e0._0_16_ = auVar83;
            auVar83 = vfmadd213ss_fma(auVar78,auVar76,ZEXT416(0xbf800000));
            local_900._0_16_ = auVar83;
            _local_8a0 = auVar4;
            auVar4 = vsubps_avx(auVar75,auVar4);
            auVar75 = vdpps_avx(auVar4,auVar4,0x7f);
            fVar224 = auVar75._0_4_;
            local_800 = auVar168;
            if (fVar224 < 0.0) {
              local_a00._0_4_ = fVar223;
              local_a20._0_4_ = fVar228 * -2.0;
              auVar260._0_4_ = sqrtf(fVar224);
              auVar260._4_60_ = extraout_var_00;
              auVar74 = ZEXT416(auVar74._0_4_);
              auVar83 = auVar260._0_16_;
              uVar70 = extraout_RAX_02;
            }
            else {
              auVar83 = vsqrtss_avx(auVar75,auVar75);
              local_a20._0_4_ = fVar228 * -2.0;
              local_a00._0_4_ = fVar223;
            }
            auVar79 = vfnmadd231ss_fma(ZEXT416((uint)(fVar242 * (fVar228 + fVar228))),
                                       ZEXT416((uint)fVar228),ZEXT416((uint)fVar228));
            auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)(fVar242 + fVar242)),
                                      ZEXT416((uint)(fVar242 * fVar242 * 3.0)));
            auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                      SUB6416(ZEXT464(0x40000000),0));
            auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * fVar228 * -3.0)),
                                      ZEXT416((uint)(fVar228 + fVar228)),auVar77);
            auVar77 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar76,
                                      ZEXT416((uint)local_a00._0_4_));
            fVar223 = auVar79._0_4_ * 0.5;
            fVar225 = auVar74._0_4_ * 0.5;
            fVar226 = auVar78._0_4_ * 0.5;
            fVar227 = auVar77._0_4_ * 0.5;
            auVar218._0_4_ = fVar227 * (float)local_9c0._0_4_;
            auVar218._4_4_ = fVar227 * (float)local_9c0._4_4_;
            auVar218._8_4_ = fVar227 * fStack_9b8;
            auVar218._12_4_ = fVar227 * fStack_9b4;
            auVar197._4_4_ = fVar226;
            auVar197._0_4_ = fVar226;
            auVar197._8_4_ = fVar226;
            auVar197._12_4_ = fVar226;
            auVar74 = vfmadd132ps_fma(auVar197,auVar218,local_980._0_16_);
            auVar175._4_4_ = fVar225;
            auVar175._0_4_ = fVar225;
            auVar175._8_4_ = fVar225;
            auVar175._12_4_ = fVar225;
            auVar74 = vfmadd132ps_fma(auVar175,auVar74,local_9a0._0_16_);
            auVar264._4_4_ = fVar223;
            auVar264._0_4_ = fVar223;
            auVar264._8_4_ = fVar223;
            auVar264._12_4_ = fVar223;
            auVar74 = vfmadd132ps_fma(auVar264,auVar74,auVar3);
            local_a00._0_16_ = vdpps_avx(auVar74,auVar74,0x7f);
            auVar53._12_4_ = 0;
            auVar53._0_12_ = ZEXT812(0);
            fVar223 = local_a00._0_4_;
            auVar77 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar223));
            fVar225 = auVar77._0_4_;
            local_a20._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar223));
            auVar26._8_4_ = 0x80000000;
            auVar26._0_8_ = 0x8000000080000000;
            auVar26._12_4_ = 0x80000000;
            auVar78 = vxorps_avx512vl(local_a00._0_16_,auVar26);
            auVar77 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                       SUB6416(ZEXT464(0x40000000),0));
            uVar71 = auVar83._0_4_;
            if (fVar223 < auVar78._0_4_) {
              fVar226 = sqrtf(fVar223);
              auVar83 = ZEXT416(uVar71);
              uVar70 = extraout_RAX_03;
            }
            else {
              auVar78 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
              fVar226 = auVar78._0_4_;
            }
            fVar223 = fVar225 * 1.5 + fVar223 * -0.5 * fVar225 * fVar225 * fVar225;
            auVar157._0_4_ = auVar74._0_4_ * fVar223;
            auVar157._4_4_ = auVar74._4_4_ * fVar223;
            auVar157._8_4_ = auVar74._8_4_ * fVar223;
            auVar157._12_4_ = auVar74._12_4_ * fVar223;
            auVar78 = vdpps_avx(auVar4,auVar157,0x7f);
            fVar228 = auVar83._0_4_;
            fVar225 = auVar78._0_4_;
            auVar158._0_4_ = fVar225 * fVar225;
            auVar158._4_4_ = auVar78._4_4_ * auVar78._4_4_;
            auVar158._8_4_ = auVar78._8_4_ * auVar78._8_4_;
            auVar158._12_4_ = auVar78._12_4_ * auVar78._12_4_;
            auVar79 = vsubps_avx512vl(auVar75,auVar158);
            fVar227 = auVar79._0_4_;
            auVar176._4_12_ = ZEXT812(0) << 0x20;
            auVar176._0_4_ = fVar227;
            auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
            auVar81 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
            if (fVar227 < 0.0) {
              local_930 = fVar223;
              fStack_92c = fVar223;
              fStack_928 = fVar223;
              fStack_924 = fVar223;
              local_920 = auVar80;
              fVar227 = sqrtf(fVar227);
              auVar81 = ZEXT416(auVar81._0_4_);
              auVar83 = ZEXT416(uVar71);
              uVar70 = extraout_RAX_04;
              auVar79 = local_920;
              fVar223 = local_930;
              fVar242 = fStack_92c;
              fVar243 = fStack_928;
              fVar244 = fStack_924;
            }
            else {
              auVar79 = vsqrtss_avx(auVar79,auVar79);
              fVar227 = auVar79._0_4_;
              auVar79 = auVar80;
              fVar242 = fVar223;
              fVar243 = fVar223;
              fVar244 = fVar223;
            }
            auVar260 = ZEXT1664(auVar4);
            auVar107 = vmovdqa64_avx512vl(auVar101);
            auVar270 = ZEXT3264(auVar107);
            auVar107 = vmovdqa64_avx512vl(auVar103);
            auVar271 = ZEXT3264(auVar107);
            auVar177._0_4_ = (float)local_900._0_4_ * (float)local_9c0._0_4_;
            auVar177._4_4_ = (float)local_900._0_4_ * (float)local_9c0._4_4_;
            auVar177._8_4_ = (float)local_900._0_4_ * fStack_9b8;
            auVar177._12_4_ = (float)local_900._0_4_ * fStack_9b4;
            auVar198._4_4_ = local_8e0._0_4_;
            auVar198._0_4_ = local_8e0._0_4_;
            auVar198._8_4_ = local_8e0._0_4_;
            auVar198._12_4_ = local_8e0._0_4_;
            auVar187 = vfmadd132ps_fma(auVar198,auVar177,local_980._0_16_);
            auVar178._4_4_ = local_8c0._0_4_;
            auVar178._0_4_ = local_8c0._0_4_;
            auVar178._8_4_ = local_8c0._0_4_;
            auVar178._12_4_ = local_8c0._0_4_;
            auVar187 = vfmadd132ps_fma(auVar178,auVar187,local_9a0._0_16_);
            auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),ZEXT416(0x40000000));
            uVar169 = auVar76._0_4_;
            auVar199._4_4_ = uVar169;
            auVar199._0_4_ = uVar169;
            auVar199._8_4_ = uVar169;
            auVar199._12_4_ = uVar169;
            auVar76 = vfmadd132ps_fma(auVar199,auVar187,auVar3);
            auVar179._0_4_ = auVar76._0_4_ * (float)local_a00._0_4_;
            auVar179._4_4_ = auVar76._4_4_ * (float)local_a00._0_4_;
            auVar179._8_4_ = auVar76._8_4_ * (float)local_a00._0_4_;
            auVar179._12_4_ = auVar76._12_4_ * (float)local_a00._0_4_;
            auVar76 = vdpps_avx(auVar74,auVar76,0x7f);
            fVar186 = auVar76._0_4_;
            auVar200._0_4_ = auVar74._0_4_ * fVar186;
            auVar200._4_4_ = auVar74._4_4_ * fVar186;
            auVar200._8_4_ = auVar74._8_4_ * fVar186;
            auVar200._12_4_ = auVar74._12_4_ * fVar186;
            auVar76 = vsubps_avx(auVar179,auVar200);
            fVar186 = auVar77._0_4_ * (float)local_a20._0_4_;
            auVar187 = vmaxss_avx(ZEXT416((uint)fVar269),
                                  ZEXT416((uint)(local_800._0_4_ * fVar229 * 1.9073486e-06)));
            auVar27._8_4_ = 0x80000000;
            auVar27._0_8_ = 0x8000000080000000;
            auVar27._12_4_ = 0x80000000;
            auVar142._16_48_ = local_800._16_48_;
            auVar82 = vxorps_avx512vl(auVar74,auVar27);
            auVar201._0_4_ = fVar223 * auVar76._0_4_ * fVar186;
            auVar201._4_4_ = fVar242 * auVar76._4_4_ * fVar186;
            auVar201._8_4_ = fVar243 * auVar76._8_4_ * fVar186;
            auVar201._12_4_ = fVar244 * auVar76._12_4_ * fVar186;
            auVar262 = ZEXT1664(auVar157);
            auVar76 = vdpps_avx(auVar82,auVar157,0x7f);
            auVar77 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar269),auVar187);
            auVar83 = vdpps_avx(auVar4,auVar201,0x7f);
            auVar207 = vfmadd213ss_fma(ZEXT416((uint)(fVar228 + 1.0)),
                                       ZEXT416((uint)(fVar269 / fVar226)),auVar77);
            fVar223 = auVar76._0_4_ + auVar83._0_4_;
            auVar76 = vdpps_avx(local_9d0,auVar157,0x7f);
            auVar83 = vdpps_avx(auVar4,auVar82,0x7f);
            auVar77 = vmulss_avx512f(auVar81,auVar79);
            fVar226 = auVar80._0_4_ * 1.5 + auVar77._0_4_ * auVar79._0_4_ * auVar79._0_4_;
            auVar77 = vdpps_avx(auVar4,local_9d0,0x7f);
            auVar80 = vfnmadd231ss_fma(auVar83,auVar78,ZEXT416((uint)fVar223));
            auVar77 = vfnmadd231ss_fma(auVar77,auVar78,auVar76);
            auVar83 = vpermilps_avx(_local_8a0,0xff);
            fVar227 = fVar227 - auVar83._0_4_;
            auVar79 = vshufps_avx(auVar74,auVar74,0xff);
            auVar83 = vfmsub213ss_fma(auVar80,ZEXT416((uint)fVar226),auVar79);
            auVar254._8_4_ = 0x80000000;
            auVar254._0_8_ = 0x8000000080000000;
            auVar254._12_4_ = 0x80000000;
            auVar256 = ZEXT1664(auVar254);
            auVar249._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
            auVar249._8_4_ = auVar83._8_4_ ^ 0x80000000;
            auVar249._12_4_ = auVar83._12_4_ ^ 0x80000000;
            auVar251 = ZEXT1664(auVar249);
            auVar77 = ZEXT416((uint)(auVar77._0_4_ * fVar226));
            auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),
                                      ZEXT416((uint)fVar223),auVar77);
            auVar83 = vinsertps_avx(auVar249,auVar77,0x1c);
            auVar236._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar236._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar236._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar77 = vinsertps_avx(ZEXT416((uint)fVar223),auVar236,0x10);
            auVar219._0_4_ = auVar80._0_4_;
            auVar219._4_4_ = auVar219._0_4_;
            auVar219._8_4_ = auVar219._0_4_;
            auVar219._12_4_ = auVar219._0_4_;
            auVar76 = vdivps_avx(auVar83,auVar219);
            auVar83 = vdivps_avx(auVar77,auVar219);
            auVar220._0_4_ = fVar225 * auVar76._0_4_ + fVar227 * auVar83._0_4_;
            auVar220._4_4_ = fVar225 * auVar76._4_4_ + fVar227 * auVar83._4_4_;
            auVar220._8_4_ = fVar225 * auVar76._8_4_ + fVar227 * auVar83._8_4_;
            auVar220._12_4_ = fVar225 * auVar76._12_4_ + fVar227 * auVar83._12_4_;
            auVar76 = vsubps_avx(local_800._0_16_,auVar220);
            auVar168 = ZEXT1664(auVar76);
            auVar28._8_4_ = 0x7fffffff;
            auVar28._0_8_ = 0x7fffffff7fffffff;
            auVar28._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx512vl(auVar78,auVar28);
            if (auVar83._0_4_ < auVar207._0_4_) {
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar207._0_4_ + auVar187._0_4_)),local_940,
                                        ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar227),auVar29);
              if (auVar77._0_4_ < auVar83._0_4_) {
                bVar69 = uVar63 < 5;
                fVar229 = auVar76._0_4_ + (float)local_950._0_4_;
                if ((fVar2 <= fVar229) &&
                   (fVar269 = *(float *)(ray + k * 4 + 0x200), fVar229 <= fVar269)) {
                  auVar76 = vmovshdup_avx(auVar76);
                  bVar62 = 0;
                  if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01ba8614;
                  auVar221._0_12_ = ZEXT812(0);
                  auVar221._12_4_ = 0;
                  auVar142._0_16_ = auVar221;
                  auVar141._4_60_ = auVar142._4_60_;
                  auVar141._0_4_ = fVar224;
                  auVar76 = vrsqrt14ss_avx512f(auVar221,auVar141._0_16_);
                  fVar223 = auVar76._0_4_;
                  auVar75 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
                  pGVar6 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar62 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01ba8614;
                    fVar223 = fVar223 * 1.5 + auVar75._0_4_ * fVar223 * fVar223 * fVar223;
                    auVar202._0_4_ = auVar4._0_4_ * fVar223;
                    auVar202._4_4_ = auVar4._4_4_ * fVar223;
                    auVar202._8_4_ = auVar4._8_4_ * fVar223;
                    auVar202._12_4_ = auVar4._12_4_ * fVar223;
                    auVar83 = vfmadd213ps_fma(auVar79,auVar202,auVar74);
                    auVar75 = vshufps_avx(auVar202,auVar202,0xc9);
                    auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar203._0_4_ = auVar202._0_4_ * auVar76._0_4_;
                    auVar203._4_4_ = auVar202._4_4_ * auVar76._4_4_;
                    auVar203._8_4_ = auVar202._8_4_ * auVar76._8_4_;
                    auVar203._12_4_ = auVar202._12_4_ * auVar76._12_4_;
                    auVar74 = vfmsub231ps_fma(auVar203,auVar74,auVar75);
                    auVar75 = vshufps_avx(auVar74,auVar74,0xc9);
                    auVar76 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar74 = vshufps_avx(auVar74,auVar74,0xd2);
                    auVar159._0_4_ = auVar83._0_4_ * auVar74._0_4_;
                    auVar159._4_4_ = auVar83._4_4_ * auVar74._4_4_;
                    auVar159._8_4_ = auVar83._8_4_ * auVar74._8_4_;
                    auVar159._12_4_ = auVar83._12_4_ * auVar74._12_4_;
                    auVar75 = vfmsub231ps_fma(auVar159,auVar75,auVar76);
                    auVar137 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar137,auVar168);
                    auVar168 = vpermps_avx512f(auVar137,ZEXT1664(auVar75));
                    auVar137 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar137,ZEXT1664(auVar75));
                    local_380 = vbroadcastss_avx512f(auVar75);
                    local_400[0] = (RTCHitN)auVar168[0];
                    local_400[1] = (RTCHitN)auVar168[1];
                    local_400[2] = (RTCHitN)auVar168[2];
                    local_400[3] = (RTCHitN)auVar168[3];
                    local_400[4] = (RTCHitN)auVar168[4];
                    local_400[5] = (RTCHitN)auVar168[5];
                    local_400[6] = (RTCHitN)auVar168[6];
                    local_400[7] = (RTCHitN)auVar168[7];
                    local_400[8] = (RTCHitN)auVar168[8];
                    local_400[9] = (RTCHitN)auVar168[9];
                    local_400[10] = (RTCHitN)auVar168[10];
                    local_400[0xb] = (RTCHitN)auVar168[0xb];
                    local_400[0xc] = (RTCHitN)auVar168[0xc];
                    local_400[0xd] = (RTCHitN)auVar168[0xd];
                    local_400[0xe] = (RTCHitN)auVar168[0xe];
                    local_400[0xf] = (RTCHitN)auVar168[0xf];
                    local_400[0x10] = (RTCHitN)auVar168[0x10];
                    local_400[0x11] = (RTCHitN)auVar168[0x11];
                    local_400[0x12] = (RTCHitN)auVar168[0x12];
                    local_400[0x13] = (RTCHitN)auVar168[0x13];
                    local_400[0x14] = (RTCHitN)auVar168[0x14];
                    local_400[0x15] = (RTCHitN)auVar168[0x15];
                    local_400[0x16] = (RTCHitN)auVar168[0x16];
                    local_400[0x17] = (RTCHitN)auVar168[0x17];
                    local_400[0x18] = (RTCHitN)auVar168[0x18];
                    local_400[0x19] = (RTCHitN)auVar168[0x19];
                    local_400[0x1a] = (RTCHitN)auVar168[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar168[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar168[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar168[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar168[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar168[0x1f];
                    local_400[0x20] = (RTCHitN)auVar168[0x20];
                    local_400[0x21] = (RTCHitN)auVar168[0x21];
                    local_400[0x22] = (RTCHitN)auVar168[0x22];
                    local_400[0x23] = (RTCHitN)auVar168[0x23];
                    local_400[0x24] = (RTCHitN)auVar168[0x24];
                    local_400[0x25] = (RTCHitN)auVar168[0x25];
                    local_400[0x26] = (RTCHitN)auVar168[0x26];
                    local_400[0x27] = (RTCHitN)auVar168[0x27];
                    local_400[0x28] = (RTCHitN)auVar168[0x28];
                    local_400[0x29] = (RTCHitN)auVar168[0x29];
                    local_400[0x2a] = (RTCHitN)auVar168[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar168[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar168[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar168[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar168[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar168[0x2f];
                    local_400[0x30] = (RTCHitN)auVar168[0x30];
                    local_400[0x31] = (RTCHitN)auVar168[0x31];
                    local_400[0x32] = (RTCHitN)auVar168[0x32];
                    local_400[0x33] = (RTCHitN)auVar168[0x33];
                    local_400[0x34] = (RTCHitN)auVar168[0x34];
                    local_400[0x35] = (RTCHitN)auVar168[0x35];
                    local_400[0x36] = (RTCHitN)auVar168[0x36];
                    local_400[0x37] = (RTCHitN)auVar168[0x37];
                    local_400[0x38] = (RTCHitN)auVar168[0x38];
                    local_400[0x39] = (RTCHitN)auVar168[0x39];
                    local_400[0x3a] = (RTCHitN)auVar168[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar168[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar168[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar168[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar168[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar168[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar168 = vmovdqa64_avx512f(local_4c0);
                    local_280 = vmovdqa64_avx512f(auVar168);
                    vpcmpeqd_avx2(auVar168._0_32_,auVar168._0_32_);
                    local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar229;
                    auVar168 = vmovdqa64_avx512f(local_500);
                    local_7c0 = vmovdqa64_avx512f(auVar168);
                    local_a50.valid = (int *)local_7c0;
                    local_a50.geometryUserPtr = pGVar6->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_400;
                    local_a50.N = 0x10;
                    local_a50.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar251 = ZEXT1664(auVar249);
                      auVar256 = ZEXT1664(auVar254);
                      auVar260 = ZEXT1664(auVar4);
                      auVar262 = ZEXT1664(auVar157);
                      (*pGVar6->occlusionFilterN)(&local_a50);
                      auVar107 = vmovdqa64_avx512vl(auVar103);
                      auVar271 = ZEXT3264(auVar107);
                      auVar107 = vmovdqa64_avx512vl(auVar101);
                      auVar270 = ZEXT3264(auVar107);
                      auVar168 = vmovdqa64_avx512f(local_7c0);
                    }
                    uVar18 = vptestmd_avx512f(auVar168,auVar168);
                    if ((short)uVar18 != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar251 = ZEXT1664(auVar251._0_16_);
                        auVar256 = ZEXT1664(auVar256._0_16_);
                        auVar260 = ZEXT1664(auVar260._0_16_);
                        auVar262 = ZEXT1664(auVar262._0_16_);
                        (*p_Var10)(&local_a50);
                        auVar107 = vmovdqa64_avx512vl(auVar103);
                        auVar271 = ZEXT3264(auVar107);
                        auVar107 = vmovdqa64_avx512vl(auVar101);
                        auVar270 = ZEXT3264(auVar107);
                        auVar168 = vmovdqa64_avx512f(local_7c0);
                      }
                      uVar70 = vptestmd_avx512f(auVar168,auVar168);
                      auVar168 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar11 = (bool)((byte)uVar70 & 1);
                      auVar143._0_4_ =
                           (uint)bVar11 * auVar168._0_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x200);
                      bVar11 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar143._4_4_ =
                           (uint)bVar11 * auVar168._4_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x204);
                      bVar11 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar143._8_4_ =
                           (uint)bVar11 * auVar168._8_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x208);
                      bVar11 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar143._12_4_ =
                           (uint)bVar11 * auVar168._12_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x20c);
                      bVar11 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar143._16_4_ =
                           (uint)bVar11 * auVar168._16_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x210);
                      bVar11 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar143._20_4_ =
                           (uint)bVar11 * auVar168._20_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x214);
                      bVar11 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar143._24_4_ =
                           (uint)bVar11 * auVar168._24_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x218);
                      bVar11 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar143._28_4_ =
                           (uint)bVar11 * auVar168._28_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x21c);
                      bVar11 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar143._32_4_ =
                           (uint)bVar11 * auVar168._32_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x220);
                      bVar11 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar143._36_4_ =
                           (uint)bVar11 * auVar168._36_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x224);
                      bVar11 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar143._40_4_ =
                           (uint)bVar11 * auVar168._40_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x228);
                      bVar11 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar143._44_4_ =
                           (uint)bVar11 * auVar168._44_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x22c);
                      bVar11 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar143._48_4_ =
                           (uint)bVar11 * auVar168._48_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x230);
                      bVar11 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar143._52_4_ =
                           (uint)bVar11 * auVar168._52_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x234);
                      bVar11 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar143._56_4_ =
                           (uint)bVar11 * auVar168._56_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x238);
                      bVar11 = SUB81(uVar70 >> 0xf,0);
                      auVar143._60_4_ =
                           (uint)bVar11 * auVar168._60_4_ |
                           (uint)!bVar11 * *(int *)(local_a50.ray + 0x23c);
                      *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar143;
                      bVar62 = 1;
                      if ((short)uVar70 != 0) goto LAB_01ba8614;
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar269;
                  }
                }
                bVar62 = 0;
                goto LAB_01ba8614;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar69 = false;
LAB_01ba8614:
          bVar68 = bVar68 | bVar69 & bVar62;
          uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar238._4_4_ = uVar169;
          auVar238._0_4_ = uVar169;
          auVar238._8_4_ = uVar169;
          auVar238._12_4_ = uVar169;
          auVar238._16_4_ = uVar169;
          auVar238._20_4_ = uVar169;
          auVar238._24_4_ = uVar169;
          auVar238._28_4_ = uVar169;
          auVar168 = ZEXT3264(auVar238);
          auVar55._4_4_ = fStack_73c;
          auVar55._0_4_ = local_740;
          auVar55._8_4_ = fStack_738;
          auVar55._12_4_ = fStack_734;
          auVar55._16_4_ = fStack_730;
          auVar55._20_4_ = fStack_72c;
          auVar55._24_4_ = fStack_728;
          auVar55._28_4_ = fStack_724;
          uVar18 = vcmpps_avx512vl(auVar238,auVar55,0xd);
        }
        uVar20 = vpcmpd_avx512vl(local_700,local_6a0,1);
        uVar19 = vpcmpd_avx512vl(local_700,_local_760,1);
        auVar183._0_4_ = (float)local_820._0_4_ + (float)local_440._0_4_;
        auVar183._4_4_ = (float)local_820._4_4_ + (float)local_440._4_4_;
        auVar183._8_4_ = fStack_818 + fStack_438;
        auVar183._12_4_ = fStack_814 + fStack_434;
        auVar183._16_4_ = fStack_810 + fStack_430;
        auVar183._20_4_ = fStack_80c + fStack_42c;
        auVar183._24_4_ = fStack_808 + fStack_428;
        auVar183._28_4_ = fStack_804 + fStack_424;
        uVar169 = auVar168._0_4_;
        auVar205._4_4_ = uVar169;
        auVar205._0_4_ = uVar169;
        auVar205._8_4_ = uVar169;
        auVar205._12_4_ = uVar169;
        auVar205._16_4_ = uVar169;
        auVar205._20_4_ = uVar169;
        auVar205._24_4_ = uVar169;
        auVar205._28_4_ = uVar169;
        uVar18 = vcmpps_avx512vl(auVar183,auVar205,2);
        bVar60 = bVar60 & (byte)uVar20 & (byte)uVar18;
        auVar222._0_4_ = (float)local_820._0_4_ + (float)local_6e0._0_4_;
        auVar222._4_4_ = (float)local_820._4_4_ + (float)local_6e0._4_4_;
        auVar222._8_4_ = fStack_818 + fStack_6d8;
        auVar222._12_4_ = fStack_814 + fStack_6d4;
        auVar222._16_4_ = fStack_810 + fStack_6d0;
        auVar222._20_4_ = fStack_80c + fStack_6cc;
        auVar222._24_4_ = fStack_808 + fStack_6c8;
        auVar222._28_4_ = fStack_804 + fStack_6c4;
        uVar18 = vcmpps_avx512vl(auVar222,auVar205,2);
        bVar57 = bVar57 & (byte)uVar19 & (byte)uVar18 | bVar60;
        if (bVar57 != 0) {
          abStack_1a0[uVar67 * 0x60] = bVar57;
          bVar69 = (bool)(bVar60 >> 1 & 1);
          bVar11 = (bool)(bVar60 >> 2 & 1);
          bVar12 = (bool)(bVar60 >> 3 & 1);
          bVar13 = (bool)(bVar60 >> 4 & 1);
          bVar14 = (bool)(bVar60 >> 5 & 1);
          auStack_180[uVar67 * 0x18] =
               (uint)(bVar60 & 1) * local_440._0_4_ | (uint)!(bool)(bVar60 & 1) * local_6e0._0_4_;
          auStack_180[uVar67 * 0x18 + 1] =
               (uint)bVar69 * local_440._4_4_ | (uint)!bVar69 * local_6e0._4_4_;
          auStack_180[uVar67 * 0x18 + 2] =
               (uint)bVar11 * (int)fStack_438 | (uint)!bVar11 * (int)fStack_6d8;
          auStack_180[uVar67 * 0x18 + 3] =
               (uint)bVar12 * (int)fStack_434 | (uint)!bVar12 * (int)fStack_6d4;
          auStack_180[uVar67 * 0x18 + 4] =
               (uint)bVar13 * (int)fStack_430 | (uint)!bVar13 * (int)fStack_6d0;
          auStack_180[uVar67 * 0x18 + 5] =
               (uint)bVar14 * (int)fStack_42c | (uint)!bVar14 * (int)fStack_6cc;
          auStack_180[uVar67 * 0x18 + 6] =
               (uint)(bVar60 >> 6) * (int)fStack_428 | (uint)!(bool)(bVar60 >> 6) * (int)fStack_6c8;
          (&fStack_164)[uVar67 * 0x18] = fStack_6c4;
          uVar70 = vmovlps_avx(local_710);
          (&uStack_160)[uVar67 * 0xc] = uVar70;
          aiStack_158[uVar67 * 0x18] = iVar66 + 1;
          uVar67 = (ulong)((int)uVar67 + 1);
        }
      }
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar137 = ZEXT3264(auVar106);
      auVar239 = ZEXT3264(_DAT_01f7b040);
    }
    do {
      uVar71 = (uint)uVar67;
      uVar67 = (ulong)(uVar71 - 1);
      if (uVar71 == 0) {
        if (bVar68 != 0) goto LAB_01ba8c01;
        uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar36._4_4_ = uVar169;
        auVar36._0_4_ = uVar169;
        auVar36._8_4_ = uVar169;
        auVar36._12_4_ = uVar169;
        auVar36._16_4_ = uVar169;
        auVar36._20_4_ = uVar169;
        auVar36._24_4_ = uVar169;
        auVar36._28_4_ = uVar169;
        uVar18 = vcmpps_avx512vl(local_680,auVar36,2);
        local_908 = (ulong)((uint)uVar18 & (uint)local_908 - 1 & (uint)local_908);
        goto LAB_01ba61b6;
      }
      auVar106 = *(undefined1 (*) [32])(auStack_180 + uVar67 * 0x18);
      auVar184._0_4_ = auVar106._0_4_ + (float)local_820._0_4_;
      auVar184._4_4_ = auVar106._4_4_ + (float)local_820._4_4_;
      auVar184._8_4_ = auVar106._8_4_ + fStack_818;
      auVar184._12_4_ = auVar106._12_4_ + fStack_814;
      auVar184._16_4_ = auVar106._16_4_ + fStack_810;
      auVar184._20_4_ = auVar106._20_4_ + fStack_80c;
      auVar184._24_4_ = auVar106._24_4_ + fStack_808;
      auVar184._28_4_ = auVar106._28_4_ + fStack_804;
      uVar169 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar35._4_4_ = uVar169;
      auVar35._0_4_ = uVar169;
      auVar35._8_4_ = uVar169;
      auVar35._12_4_ = uVar169;
      auVar35._16_4_ = uVar169;
      auVar35._20_4_ = uVar169;
      auVar35._24_4_ = uVar169;
      auVar35._28_4_ = uVar169;
      uVar18 = vcmpps_avx512vl(auVar184,auVar35,2);
      uVar144 = (uint)uVar18 & (uint)abStack_1a0[uVar67 * 0x60];
    } while (uVar144 == 0);
    uVar70 = (&uStack_160)[uVar67 * 0xc];
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar70;
    auVar206._8_4_ = 0x7f800000;
    auVar206._0_8_ = 0x7f8000007f800000;
    auVar206._12_4_ = 0x7f800000;
    auVar206._16_4_ = 0x7f800000;
    auVar206._20_4_ = 0x7f800000;
    auVar206._24_4_ = 0x7f800000;
    auVar206._28_4_ = 0x7f800000;
    auVar107 = vblendmps_avx512vl(auVar206,auVar106);
    bVar57 = (byte)uVar144;
    auVar136._0_4_ =
         (uint)(bVar57 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)auVar106._0_4_;
    bVar69 = (bool)((byte)(uVar144 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar69 * auVar107._4_4_ | (uint)!bVar69 * (int)auVar106._4_4_;
    bVar69 = (bool)((byte)(uVar144 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar69 * auVar107._8_4_ | (uint)!bVar69 * (int)auVar106._8_4_;
    bVar69 = (bool)((byte)(uVar144 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar69 * auVar107._12_4_ | (uint)!bVar69 * (int)auVar106._12_4_;
    bVar69 = (bool)((byte)(uVar144 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar69 * auVar107._16_4_ | (uint)!bVar69 * (int)auVar106._16_4_;
    bVar69 = (bool)((byte)(uVar144 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar69 * auVar107._20_4_ | (uint)!bVar69 * (int)auVar106._20_4_;
    bVar69 = (bool)((byte)(uVar144 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar69 * auVar107._24_4_ | (uint)!bVar69 * (int)auVar106._24_4_;
    auVar136._28_4_ =
         (uVar144 >> 7) * auVar107._28_4_ | (uint)!SUB41(uVar144 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar106 = vminps_avx(auVar136,auVar106);
    auVar107 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar107);
    auVar107 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar107);
    uVar18 = vcmpps_avx512vl(auVar136,auVar106,0);
    bVar64 = (byte)uVar18 & bVar57;
    if (bVar64 != 0) {
      uVar144 = (uint)bVar64;
    }
    uVar145 = 0;
    for (; (uVar144 & 1) == 0; uVar144 = uVar144 >> 1 | 0x80000000) {
      uVar145 = uVar145 + 1;
    }
    iVar66 = aiStack_158[uVar67 * 0x18];
    bVar57 = ~('\x01' << ((byte)uVar145 & 0x1f)) & bVar57;
    abStack_1a0[uVar67 * 0x60] = bVar57;
    if (bVar57 == 0) {
      uVar71 = uVar71 - 1;
    }
    uVar169 = (undefined4)uVar70;
    auVar167._4_4_ = uVar169;
    auVar167._0_4_ = uVar169;
    auVar167._8_4_ = uVar169;
    auVar167._12_4_ = uVar169;
    auVar167._16_4_ = uVar169;
    auVar167._20_4_ = uVar169;
    auVar167._24_4_ = uVar169;
    auVar167._28_4_ = uVar169;
    auVar75 = vmovshdup_avx(auVar180);
    auVar75 = vsubps_avx(auVar75,auVar180);
    auVar185._0_4_ = auVar75._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar75 = vfmadd132ps_fma(auVar185,auVar167,auVar239._0_32_);
    auVar106 = ZEXT1632(auVar75);
    local_400[0] = (RTCHitN)auVar106[0];
    local_400[1] = (RTCHitN)auVar106[1];
    local_400[2] = (RTCHitN)auVar106[2];
    local_400[3] = (RTCHitN)auVar106[3];
    local_400[4] = (RTCHitN)auVar106[4];
    local_400[5] = (RTCHitN)auVar106[5];
    local_400[6] = (RTCHitN)auVar106[6];
    local_400[7] = (RTCHitN)auVar106[7];
    local_400[8] = (RTCHitN)auVar106[8];
    local_400[9] = (RTCHitN)auVar106[9];
    local_400[10] = (RTCHitN)auVar106[10];
    local_400[0xb] = (RTCHitN)auVar106[0xb];
    local_400[0xc] = (RTCHitN)auVar106[0xc];
    local_400[0xd] = (RTCHitN)auVar106[0xd];
    local_400[0xe] = (RTCHitN)auVar106[0xe];
    local_400[0xf] = (RTCHitN)auVar106[0xf];
    local_400[0x10] = (RTCHitN)auVar106[0x10];
    local_400[0x11] = (RTCHitN)auVar106[0x11];
    local_400[0x12] = (RTCHitN)auVar106[0x12];
    local_400[0x13] = (RTCHitN)auVar106[0x13];
    local_400[0x14] = (RTCHitN)auVar106[0x14];
    local_400[0x15] = (RTCHitN)auVar106[0x15];
    local_400[0x16] = (RTCHitN)auVar106[0x16];
    local_400[0x17] = (RTCHitN)auVar106[0x17];
    local_400[0x18] = (RTCHitN)auVar106[0x18];
    local_400[0x19] = (RTCHitN)auVar106[0x19];
    local_400[0x1a] = (RTCHitN)auVar106[0x1a];
    local_400[0x1b] = (RTCHitN)auVar106[0x1b];
    local_400[0x1c] = (RTCHitN)auVar106[0x1c];
    local_400[0x1d] = (RTCHitN)auVar106[0x1d];
    local_400[0x1e] = (RTCHitN)auVar106[0x1e];
    local_400[0x1f] = (RTCHitN)auVar106[0x1f];
    local_710._8_8_ = 0;
    local_710._0_8_ = *(ulong *)(local_400 + (ulong)uVar145 * 4);
    uVar67 = (ulong)uVar71;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }